

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O1

void doc_compression_test(void)

{
  fdb_encryption_key new_key;
  void *ptr;
  long lVar1;
  fdb_kvs_handle **ppfVar2;
  fdb_status fVar3;
  int iVar4;
  btree *ptr_fhandle;
  size_t sVar5;
  btree *config;
  size_t sVar6;
  size_t sVar7;
  fdb_doc *pfVar8;
  fdb_kvs_handle *pfVar9;
  fdb_kvs_handle **ppfVar10;
  fdb_file_handle *doc;
  fdb_file_handle *ptr_handle;
  fdb_kvs_handle *handle;
  fdb_config *pfVar11;
  fdb_doc **ppfVar12;
  fdb_doc *pfVar13;
  char *ptr_handle_00;
  uint uVar14;
  fdb_kvs_handle *unaff_RBP;
  fdb_encryption_key *pfVar15;
  char *pcVar16;
  fdb_file_handle *unaff_R12;
  long lVar17;
  fdb_kvs_handle *unaff_R13;
  fdb_file_handle **ptr_fhandle_00;
  ulong uVar18;
  fdb_kvs_config *config_00;
  fdb_kvs_handle *pfVar19;
  fdb_doc **doc_00;
  fdb_doc *pfVar20;
  list *doc_01;
  fdb_kvs_handle **ppfVar21;
  char *pcVar22;
  bool bVar23;
  fdb_doc *rdoc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  char temp [256];
  char bodybuf [256];
  char metabuf [256];
  fdb_config fconfig;
  char keybuf [256];
  fdb_kvs_handle *pfStack_1dc00;
  fdb_file_handle *pfStack_1dbf8;
  void *pvStack_1dbf0;
  size_t asStack_1dbe8 [3];
  undefined4 uStack_1dbd0;
  undefined4 uStack_1dbcc;
  undefined4 uStack_1dbc8;
  undefined4 uStack_1dbc4;
  undefined4 uStack_1dbc0;
  fdb_kvs_config fStack_1dbb8;
  timeval tStack_1dba0;
  fdb_config fStack_1db90;
  char acStack_1da98 [256];
  char acStack_1d998 [256];
  char acStack_1d898 [264];
  fdb_config *pfStack_1d790;
  fdb_kvs_handle **ppfStack_1d788;
  fdb_kvs_handle *pfStack_1d780;
  fdb_kvs_handle **ppfStack_1d778;
  fdb_kvs_handle *pfStack_1d770;
  code *pcStack_1d768;
  fdb_kvs_handle *pfStack_1d750;
  fdb_file_handle *pfStack_1d748;
  fdb_kvs_handle *pfStack_1d740;
  fdb_kvs_handle *pfStack_1d738;
  fdb_kvs_config fStack_1d730;
  timeval tStack_1d718;
  fdb_config fStack_1d708;
  fdb_kvs_handle *apfStack_1d610 [32];
  fdb_config fStack_1d510;
  fdb_kvs_handle **ppfStack_1d408;
  fdb_kvs_handle **ppfStack_1d400;
  fdb_kvs_handle **ppfStack_1d3f8;
  fdb_kvs_handle *pfStack_1d3f0;
  fdb_kvs_handle *pfStack_1d3e0;
  fdb_kvs_handle *pfStack_1d3d8;
  fdb_kvs_handle **ppfStack_1d3d0;
  fdb_kvs_handle *pfStack_1d3c8;
  fdb_kvs_config fStack_1d3c0;
  undefined1 auStack_1d3a8 [128];
  fdb_kvs_handle *apfStack_1d328 [33];
  fdb_config fStack_1d220;
  fdb_kvs_handle *apfStack_1d128 [32];
  fdb_kvs_handle *apfStack_1d028 [32];
  fdb_kvs_handle fStack_1cf28;
  undefined8 auStack_1cb28 [896];
  fdb_kvs_handle *apfStack_1af28 [1025];
  fdb_doc **ppfStack_18f20;
  char *pcStack_18f18;
  long lStack_18f10;
  fdb_doc *pfStack_18f08;
  fdb_doc **ppfStack_18f00;
  fdb_doc *pfStack_18ef8;
  fdb_doc *pfStack_18ee0;
  fdb_file_handle *pfStack_18ed8;
  long lStack_18ed0;
  fdb_kvs_handle *pfStack_18ec8;
  long lStack_18ec0;
  long lStack_18eb8;
  fdb_doc **ppfStack_18eb0;
  long lStack_18ea8;
  fdb_doc **ppfStack_18ea0;
  size_t sStack_18e98;
  timeval tStack_18e90;
  fdb_kvs_config fStack_18e80;
  fdb_file_info fStack_18e68;
  fdb_doc afStack_18e20 [3];
  char acStack_18d20 [264];
  fdb_config fStack_18c18;
  char acStack_18b20 [256];
  fdb_doc *apfStack_18a20 [2999];
  size_t sStack_12c68;
  size_t asStack_12c60 [1023];
  undefined1 auStack_10c61 [57225];
  fdb_doc **ppfStack_2cd8;
  fdb_config *pfStack_2cd0;
  fdb_file_handle **ppfStack_2cc8;
  ulong uStack_2cc0;
  fdb_kvs_handle **ppfStack_2cb8;
  fdb_kvs_handle **ppfStack_2cb0;
  fdb_doc *pfStack_2c98;
  fdb_kvs_handle *pfStack_2c90;
  undefined1 auStack_2c88 [24];
  fdb_file_handle *pfStack_2c70;
  fdb_kvs_handle *pfStack_2c68;
  fdb_kvs_config fStack_2c60;
  fdb_doc *apfStack_2c48 [31];
  timeval tStack_2b50;
  fdb_config fStack_2b40;
  char acStack_2a48 [256];
  fdb_file_handle *apfStack_2948 [32];
  char acStack_2848 [264];
  fdb_kvs_handle **ppfStack_2740;
  char *pcStack_2738;
  char *pcStack_2730;
  ulong uStack_2728;
  undefined8 uStack_2720;
  code *pcStack_2718;
  fdb_file_handle *pfStack_2710;
  fdb_kvs_handle *pfStack_2708;
  char acStack_2700 [32];
  fdb_kvs_config fStack_26e0;
  timeval tStack_26c8;
  fdb_file_info afStack_26b8 [3];
  fdb_config fStack_25c0;
  fdb_config *pfStack_24c8;
  fdb_kvs_handle **ppfStack_24c0;
  fdb_kvs_handle *pfStack_24b8;
  fdb_doc *pfStack_24b0;
  fdb_kvs_handle *pfStack_24a8;
  fdb_encryption_key *pfStack_24a0;
  fdb_kvs_handle *pfStack_2490;
  fdb_file_handle *pfStack_2488;
  undefined1 auStack_2480 [8];
  undefined1 auStack_2478 [48];
  fdb_kvs_handle *apfStack_2448 [32];
  fdb_doc afStack_2348 [3];
  fdb_config fStack_2248;
  ulong uStack_2150;
  fdb_kvs_handle **ppfStack_2148;
  fdb_kvs_handle *pfStack_2140;
  fdb_doc *pfStack_2138;
  fdb_kvs_handle *pfStack_2130;
  fdb_encryption_key *pfStack_2128;
  fdb_doc *pfStack_2118;
  fdb_kvs_handle *pfStack_2110;
  fdb_kvs_handle *pfStack_2108;
  fdb_file_handle *pfStack_2100;
  fdb_file_handle *pfStack_20f8;
  fdb_doc *apfStack_20f0 [11];
  fdb_kvs_config fStack_2098;
  timeval tStack_2080;
  fdb_kvs_handle fStack_2070;
  fdb_config fStack_1d70;
  fdb_kvs_config *pfStack_1c78;
  fdb_file_handle **ppfStack_1c70;
  fdb_file_handle **ppfStack_1c68;
  fdb_kvs_handle **ppfStack_1c60;
  char *pcStack_1c58;
  fdb_kvs_handle *pfStack_1c50;
  fdb_file_handle *pfStack_1c38;
  fdb_file_handle *pfStack_1c30;
  fdb_kvs_handle *pfStack_1c28;
  fdb_kvs_handle *pfStack_1c20;
  timeval tStack_1c18;
  fdb_doc *apfStack_1c08 [31];
  fdb_kvs_config fStack_1b10;
  char acStack_1af8 [264];
  fdb_config fStack_19f0;
  char acStack_18f8 [256];
  char acStack_17f8 [264];
  fdb_kvs_handle *pfStack_16f0;
  fdb_file_handle *pfStack_16e8;
  fdb_kvs_handle *pfStack_16e0;
  fdb_kvs_handle *pfStack_16d8;
  fdb_kvs_handle **ppfStack_16d0;
  fdb_kvs_handle *pfStack_16c8;
  fdb_kvs_handle *pfStack_16b8;
  fdb_kvs_handle *pfStack_16b0;
  undefined1 auStack_16a8 [32];
  undefined1 auStack_1688 [280];
  undefined1 auStack_1570 [776];
  fdb_file_handle *pfStack_1268;
  fdb_file_handle *pfStack_1260;
  fdb_kvs_handle *pfStack_1258;
  fdb_doc *pfStack_1250;
  list *plStack_1248;
  fdb_kvs_handle *pfStack_1240;
  undefined1 auStack_1230 [16];
  undefined1 auStack_1220 [48];
  size_t *psStack_11f0;
  timeval tStack_11c0;
  fdb_doc afStack_11b0 [3];
  undefined1 auStack_1098 [520];
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined4 uStack_e7c;
  undefined4 uStack_e74;
  undefined1 uStack_e69;
  fdb_doc *pfStack_da0;
  fdb_file_handle *pfStack_d98;
  fdb_kvs_handle *pfStack_d90;
  fdb_kvs_config *pfStack_d88;
  fdb_doc *pfStack_d80;
  fdb_kvs_handle *pfStack_d78;
  undefined1 auStack_d68 [16];
  undefined1 auStack_d58 [16];
  timeval tStack_d48;
  fdb_kvs_config fStack_d38;
  fdb_file_handle afStack_d20 [6];
  fdb_kvs_handle fStack_c20;
  fdb_kvs_config afStack_900 [10];
  void *apvStack_800 [32];
  fdb_custom_cmp_variable p_Stack_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined4 uStack_6e4;
  undefined4 uStack_6dc;
  undefined1 uStack_6d1;
  fdb_kvs_handle **ppfStack_608;
  fdb_file_handle *pfStack_600;
  fdb_kvs_handle *pfStack_5f8;
  btree *pbStack_5f0;
  btree *pbStack_5e8;
  fdb_kvs_handle *pfStack_5e0;
  fdb_kvs_handle *local_5d0;
  undefined1 local_5c8 [16];
  fdb_file_handle fStack_5b8;
  size_t *local_590;
  undefined1 local_560 [40];
  undefined8 local_538;
  void *pvStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  ulong local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined1 local_4f8;
  undefined1 local_438 [520];
  fdb_config local_230;
  char local_138 [264];
  
  pfStack_5e0 = (fdb_kvs_handle *)0x115f7a;
  gettimeofday((timeval *)(local_560 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_5e0 = (fdb_kvs_handle *)0x115f7f;
  memleak_start();
  local_5d0 = (fdb_kvs_handle *)0x0;
  pfStack_5e0 = (fdb_kvs_handle *)0x115f90;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_5e0 = (fdb_kvs_handle *)0x115fa0;
  fdb_get_default_config();
  config = (btree *)local_560;
  pfStack_5e0 = (fdb_kvs_handle *)0x115fad;
  fdb_get_default_kvs_config();
  local_230.buffercache_size = 0;
  local_230.wal_threshold = 0x400;
  local_230.flags = 1;
  local_230.compress_document_body = true;
  local_230.compaction_threshold = '\0';
  local_230.purging_interval = 1;
  ptr_fhandle = (btree *)(local_5c8 + 8);
  pfStack_5e0 = (fdb_kvs_handle *)0x115fe3;
  fdb_open((fdb_file_handle **)ptr_fhandle,"./dummy1",&local_230);
  ppfVar10 = (fdb_kvs_handle **)local_5c8;
  pfStack_5e0 = (fdb_kvs_handle *)0x115ff6;
  fdb_kvs_open_default((fdb_file_handle *)local_5c8._8_8_,ppfVar10,(fdb_kvs_config *)config);
  pfStack_5e0 = (fdb_kvs_handle *)0x11600c;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_5c8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001164b8;
  local_528 = 0x6161616161616161;
  uStack_520 = 0x6161616161616161;
  local_538._0_2_ = 0x6161;
  local_538._2_6_ = 0x616161616161;
  pvStack_530 = (void *)0x6161616161616161;
  local_518 = local_518 & 0xffffffffffffff00;
  unaff_R13 = (fdb_kvs_handle *)0x0;
  uVar18 = 0;
  do {
    pfStack_5e0 = (fdb_kvs_handle *)0x116050;
    sprintf(local_138,"key%d",uVar18 & 0xffffffff);
    pfStack_5e0 = (fdb_kvs_handle *)0x116069;
    sprintf(local_438 + 0x100,"meta%d",uVar18 & 0xffffffff);
    pfStack_5e0 = (fdb_kvs_handle *)0x11608a;
    sprintf(local_438,"body%d_%s",uVar18 & 0xffffffff,&local_538);
    unaff_R12 = (fdb_file_handle *)((long)&fStack_5b8.root + (long)unaff_R13);
    pfStack_5e0 = (fdb_kvs_handle *)0x11609a;
    unaff_RBP = (fdb_kvs_handle *)strlen(local_138);
    pfStack_5e0 = (fdb_kvs_handle *)0x1160ad;
    ptr_fhandle = (btree *)strlen(local_438 + 0x100);
    pfStack_5e0 = (fdb_kvs_handle *)0x1160bd;
    sVar5 = strlen(local_438);
    pfStack_5e0 = (fdb_kvs_handle *)0x1160e2;
    fdb_doc_create((fdb_doc **)unaff_R12,local_138,(size_t)unaff_RBP,local_438 + 0x100,
                   (size_t)ptr_fhandle,local_438,sVar5);
    pfStack_5e0 = (fdb_kvs_handle *)0x1160f1;
    fdb_set((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)(&fStack_5b8.root)[uVar18]);
    uVar18 = uVar18 + 1;
    unaff_R13 = (fdb_kvs_handle *)((long)unaff_R13 + 8);
  } while (uVar18 != 10);
  ppfVar10 = &local_5d0;
  pfStack_5e0 = (fdb_kvs_handle *)0x11612e;
  fdb_doc_create((fdb_doc **)ppfVar10,(void *)local_590[4],*local_590,(void *)local_590[7],
                 local_590[1],(void *)0x0,0);
  pfStack_5e0 = (fdb_kvs_handle *)0x11613b;
  fVar3 = fdb_del((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
  config = (btree *)0xa;
  if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001164bd;
  pfStack_5e0 = (fdb_kvs_handle *)0x11614d;
  fdb_doc_free((fdb_doc *)local_5d0);
  local_5d0 = (fdb_kvs_handle *)0x0;
  ppfVar10 = (fdb_kvs_handle **)(local_5c8 + 8);
  pfStack_5e0 = (fdb_kvs_handle *)0x116165;
  fdb_commit((fdb_file_handle *)local_5c8._8_8_,'\0');
  config = (btree *)local_5c8;
  pfStack_5e0 = (fdb_kvs_handle *)0x116172;
  fdb_kvs_close((fdb_kvs_handle *)local_5c8._0_8_);
  pfStack_5e0 = (fdb_kvs_handle *)0x11617a;
  fdb_close((fdb_file_handle *)local_5c8._8_8_);
  pfStack_5e0 = (fdb_kvs_handle *)0x116191;
  fdb_open((fdb_file_handle **)ppfVar10,"./dummy1",&local_230);
  pfStack_5e0 = (fdb_kvs_handle *)0x1161a1;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_5c8._8_8_,(fdb_kvs_handle **)config,
             (fdb_kvs_config *)local_560);
  pfStack_5e0 = (fdb_kvs_handle *)0x1161b7;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_5c8._0_8_,logCallbackFunc,"doc_compression_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    local_508 = 0x6262626262626262;
    uStack_500 = 0x6262626262626262;
    local_518 = 0x6262626262626262;
    uStack_510 = 0x6262626262626262;
    local_528 = 0x6262626262626262;
    uStack_520 = 0x6262626262626262;
    local_538._0_2_ = 0x6262;
    local_538._2_6_ = 0x626262626262;
    pvStack_530 = (void *)0x6262626262626262;
    local_4f8 = 0;
    ptr_fhandle = (btree *)(local_438 + 0x100);
    lVar17 = 0;
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_5e0 = (fdb_kvs_handle *)0x116209;
      sprintf((char *)ptr_fhandle,"newmeta%d",(ulong)unaff_RBP & 0xffffffff);
      pfStack_5e0 = (fdb_kvs_handle *)0x116224;
      sprintf((char *)local_438,"newbody%d_%s",(ulong)unaff_RBP & 0xffffffff,&local_538);
      pfStack_5e0 = (fdb_kvs_handle *)0x116234;
      config = (btree *)strlen((char *)ptr_fhandle);
      pfStack_5e0 = (fdb_kvs_handle *)0x11623f;
      sVar5 = strlen((char *)local_438);
      pfStack_5e0 = (fdb_kvs_handle *)0x116253;
      fdb_doc_update((fdb_doc **)((long)&fStack_5b8.root + lVar17),ptr_fhandle,(size_t)config,
                     (fdb_kvs_handle *)local_438,sVar5);
      pfStack_5e0 = (fdb_kvs_handle *)0x116262;
      fdb_set((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)(&fStack_5b8.root)[(long)unaff_RBP]);
      unaff_RBP = (fdb_kvs_handle *)((long)unaff_RBP + 1);
      lVar17 = lVar17 + 8;
    } while (unaff_RBP == (fdb_kvs_handle *)0x1);
    unaff_R12 = (fdb_file_handle *)0x0;
    pfStack_5e0 = (fdb_kvs_handle *)0x11627e;
    fdb_commit((fdb_file_handle *)local_5c8._8_8_,'\0');
    pfVar9 = (fdb_kvs_handle *)local_438;
    do {
      pfStack_5e0 = (fdb_kvs_handle *)0x1162a7;
      fdb_doc_create((fdb_doc **)&local_5d0,(&fStack_5b8.root)[(long)unaff_R12]->op_stats,
                     *(size_t *)&(&fStack_5b8.root)[(long)unaff_R12]->kvs_config,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_5e0 = (fdb_kvs_handle *)0x1162b6;
      fVar3 = fdb_get((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
      unaff_R13 = local_5d0;
      if (unaff_R12 != (fdb_file_handle *)0x5) {
        if (fVar3 == FDB_RESULT_SUCCESS) {
          config = local_5d0->staletree;
          unaff_RBP = (&fStack_5b8.root)[(long)unaff_R12];
          ptr_fhandle = unaff_RBP->staletree;
          pfStack_5e0 = (fdb_kvs_handle *)0x1162ef;
          iVar4 = bcmp(config,ptr_fhandle,(size_t)(local_5d0->kvs_config).custom_cmp);
          if (iVar4 == 0) {
            config = (unaff_R13->field_6).seqtree;
            ptr_fhandle = (unaff_RBP->field_6).seqtree;
            pfStack_5e0 = (fdb_kvs_handle *)0x11630e;
            iVar4 = bcmp(config,ptr_fhandle,(size_t)(unaff_R13->kvs_config).custom_cmp_param);
            if (iVar4 == 0) goto LAB_00116316;
            pfStack_5e0 = (fdb_kvs_handle *)0x116483;
            doc_compression_test();
            pfVar9 = unaff_R13;
            goto LAB_00116483;
          }
        }
        else {
LAB_00116483:
          unaff_R13 = pfVar9;
          pfStack_5e0 = (fdb_kvs_handle *)0x116488;
          doc_compression_test();
        }
        pfStack_5e0 = (fdb_kvs_handle *)0x116493;
        doc_compression_test();
        pfVar9 = unaff_R13;
LAB_00116493:
        pfStack_5e0 = (fdb_kvs_handle *)0x116498;
        doc_compression_test();
        goto LAB_00116498;
      }
      unaff_R13 = pfVar9;
      if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116493;
LAB_00116316:
      pfStack_5e0 = (fdb_kvs_handle *)0x116320;
      fdb_doc_free((fdb_doc *)local_5d0);
      local_5d0 = (fdb_kvs_handle *)0x0;
      unaff_R12 = (fdb_file_handle *)((long)&unaff_R12->root + 1);
      pfVar9 = unaff_R13;
    } while (unaff_R12 != (fdb_file_handle *)0xa);
    pfStack_5e0 = (fdb_kvs_handle *)0x116347;
    fdb_compact((fdb_file_handle *)local_5c8._8_8_,"./dummy2");
    unaff_R12 = (fdb_file_handle *)0x0;
    do {
      pfStack_5e0 = (fdb_kvs_handle *)0x116373;
      fdb_doc_create((fdb_doc **)&local_5d0,(&fStack_5b8.root)[(long)unaff_R12]->op_stats,
                     *(size_t *)&(&fStack_5b8.root)[(long)unaff_R12]->kvs_config,(void *)0x0,0,
                     (void *)0x0,0);
      pfStack_5e0 = (fdb_kvs_handle *)0x116382;
      fVar3 = fdb_get((fdb_kvs_handle *)local_5c8._0_8_,(fdb_doc *)local_5d0);
      pfVar9 = local_5d0;
      if (unaff_R12 == (fdb_file_handle *)0x5) {
        pfVar9 = unaff_R13;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001164b3;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001164a3;
        config = local_5d0->staletree;
        unaff_RBP = (&fStack_5b8.root)[(long)unaff_R12];
        ptr_fhandle = unaff_RBP->staletree;
        pfStack_5e0 = (fdb_kvs_handle *)0x1163bb;
        iVar4 = bcmp(config,ptr_fhandle,(size_t)(local_5d0->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_001164a8;
        config = (pfVar9->field_6).seqtree;
        ptr_fhandle = (unaff_RBP->field_6).seqtree;
        pfStack_5e0 = (fdb_kvs_handle *)0x1163da;
        iVar4 = bcmp(config,ptr_fhandle,(size_t)(pfVar9->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_00116498;
      }
      pfStack_5e0 = (fdb_kvs_handle *)0x1163ec;
      fdb_doc_free((fdb_doc *)local_5d0);
      local_5d0 = (fdb_kvs_handle *)0x0;
      unaff_R12 = (fdb_file_handle *)((long)&unaff_R12->root + 1);
      unaff_R13 = pfVar9;
      if (unaff_R12 == (fdb_file_handle *)0xa) {
        lVar17 = 0;
        do {
          pfStack_5e0 = (fdb_kvs_handle *)0x11640e;
          fdb_doc_free((fdb_doc *)(&fStack_5b8.root)[lVar17]);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 10);
        pfStack_5e0 = (fdb_kvs_handle *)0x116421;
        fdb_kvs_close((fdb_kvs_handle *)local_5c8._0_8_);
        pfStack_5e0 = (fdb_kvs_handle *)0x11642b;
        fdb_close((fdb_file_handle *)local_5c8._8_8_);
        pfStack_5e0 = (fdb_kvs_handle *)0x116430;
        fdb_shutdown();
        pfStack_5e0 = (fdb_kvs_handle *)0x116435;
        memleak_end();
        pcVar16 = "%s PASSED\n";
        if (doc_compression_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        pfStack_5e0 = (fdb_kvs_handle *)0x116466;
        fprintf(_stderr,pcVar16,"document compression test");
        return;
      }
    } while( true );
  }
  goto LAB_001164c2;
LAB_00116f9c:
  pfStack_1240 = (fdb_kvs_handle *)0x116fa1;
  purge_logically_deleted_doc_test();
  pfVar9 = unaff_RBP;
LAB_00116fa1:
  pfStack_1240 = (fdb_kvs_handle *)0x116fa6;
  purge_logically_deleted_doc_test();
LAB_00116fa6:
  pfStack_1240 = (fdb_kvs_handle *)0x116fab;
  purge_logically_deleted_doc_test();
LAB_00116fab:
  pfStack_1240 = (fdb_kvs_handle *)0x116fb6;
  purge_logically_deleted_doc_test();
LAB_00116fb6:
  pfStack_1240 = (fdb_kvs_handle *)0x116fbb;
  purge_logically_deleted_doc_test();
LAB_00116fbb:
  pfStack_1240 = (fdb_kvs_handle *)0x116fc6;
  purge_logically_deleted_doc_test();
  ptr_handle = doc;
  unaff_RBP = pfVar9;
LAB_00116fc6:
  pfStack_1240 = (fdb_kvs_handle *)0x116fcb;
  purge_logically_deleted_doc_test();
  goto LAB_00116fcb;
LAB_001172d0:
  pfStack_16c8 = (fdb_kvs_handle *)0x1172e0;
  api_wrapper_test();
LAB_001172e0:
  pfStack_16c8 = (fdb_kvs_handle *)0x1172e5;
  api_wrapper_test();
LAB_001172e5:
  pfVar19 = (fdb_kvs_handle *)(auStack_1688 + 0x18);
  pfStack_16c8 = (fdb_kvs_handle *)0x1172ea;
  api_wrapper_test();
  goto LAB_001172ea;
LAB_00117e03:
  pfStack_2128 = (fdb_encryption_key *)0x117e13;
  flush_before_commit_multi_writers_test();
  pfVar13 = pfVar8;
  goto LAB_00117e13;
LAB_00118159:
  pfStack_24a0 = (fdb_encryption_key *)0x118166;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar16;
LAB_00118166:
  pcVar16 = (char *)pfVar19;
  pfStack_24a0 = (fdb_encryption_key *)0x11816b;
  auto_commit_test();
LAB_0011816b:
  pfStack_24a0 = (fdb_encryption_key *)0x118178;
  auto_commit_test();
  pfVar19 = (fdb_kvs_handle *)pcVar16;
LAB_00118178:
  pfVar8 = afStack_2348;
  ppfVar10 = apfStack_2448;
  pfStack_24a0 = (fdb_encryption_key *)0x11817d;
  auto_commit_test();
  goto LAB_0011817d;
LAB_0011943e:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119443;
  open_multi_files_kvs_test();
LAB_00119443:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119448;
  open_multi_files_kvs_test();
LAB_00119448:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x11944d;
  open_multi_files_kvs_test();
LAB_0011944d:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119452;
  open_multi_files_kvs_test();
  pfVar9 = (fdb_kvs_handle *)pcVar22;
LAB_00119452:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119457;
  open_multi_files_kvs_test();
LAB_00119457:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x11945c;
  open_multi_files_kvs_test();
LAB_0011945c:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119461;
  open_multi_files_kvs_test();
LAB_00119461:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119466;
  open_multi_files_kvs_test();
LAB_00119466:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x11946b;
  open_multi_files_kvs_test();
  goto LAB_0011946b;
LAB_00119a0a:
  rekey_test();
  goto LAB_00119a1a;
LAB_00116498:
  pfStack_5e0 = (fdb_kvs_handle *)0x1164a3;
  doc_compression_test();
  unaff_R13 = pfVar9;
LAB_001164a3:
  pfVar9 = unaff_R13;
  pfStack_5e0 = (fdb_kvs_handle *)0x1164a8;
  doc_compression_test();
LAB_001164a8:
  pfStack_5e0 = (fdb_kvs_handle *)0x1164b3;
  doc_compression_test();
  unaff_R13 = pfVar9;
LAB_001164b3:
  ppfVar10 = &local_5d0;
  pfStack_5e0 = (fdb_kvs_handle *)0x1164b8;
  doc_compression_test();
LAB_001164b8:
  pfStack_5e0 = (fdb_kvs_handle *)0x1164bd;
  doc_compression_test();
LAB_001164bd:
  pfStack_5e0 = (fdb_kvs_handle *)0x1164c2;
  doc_compression_test();
LAB_001164c2:
  pfStack_5e0 = (fdb_kvs_handle *)read_doc_by_offset_test;
  doc_compression_test();
  pfStack_d78 = (fdb_kvs_handle *)0x1164e4;
  ppfStack_608 = ppfVar10;
  pfStack_600 = unaff_R12;
  pfStack_5f8 = unaff_R13;
  pbStack_5f0 = config;
  pbStack_5e8 = ptr_fhandle;
  pfStack_5e0 = unaff_RBP;
  gettimeofday(&tStack_d48,(__timezone_ptr_t)0x0);
  pfStack_d78 = (fdb_kvs_handle *)0x1164e9;
  memleak_start();
  pfStack_d78 = (fdb_kvs_handle *)0x1164f5;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_d78 = (fdb_kvs_handle *)0x116505;
  fdb_get_default_config();
  config_00 = &fStack_d38;
  pfStack_d78 = (fdb_kvs_handle *)0x116512;
  fdb_get_default_kvs_config();
  uStack_6f8 = 0;
  uStack_6f0 = 0x400;
  uStack_6dc = 1;
  uStack_6e4 = 0xe10;
  uStack_6d1 = 0;
  pfVar8 = (fdb_doc *)auStack_d58;
  pfStack_d78 = (fdb_kvs_handle *)0x11654b;
  fdb_open((fdb_file_handle **)pfVar8,"./dummy1",(fdb_config *)&afStack_900[0x15].custom_cmp);
  pfVar13 = (fdb_doc *)(auStack_d68 + 8);
  pfStack_d78 = (fdb_kvs_handle *)0x11655e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_d58._0_8_,(fdb_kvs_handle **)pfVar13,config_00);
  pfStack_d78 = (fdb_kvs_handle *)0x116574;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_d68._8_8_,logCallbackFunc,"read_doc_by_offset_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    lVar17 = 0;
    uVar18 = 0;
    do {
      pfStack_d78 = (fdb_kvs_handle *)0x11659c;
      sprintf((char *)&afStack_900[10].custom_cmp_param,"key%d",uVar18 & 0xffffffff);
      pfStack_d78 = (fdb_kvs_handle *)0x1165b4;
      sprintf(&afStack_900[0].create_if_missing,"meta%d",uVar18 & 0xffffffff);
      pfStack_d78 = (fdb_kvs_handle *)0x1165c9;
      sprintf((char *)afStack_d20,"body%d",uVar18 & 0xffffffff);
      pfStack_d78 = (fdb_kvs_handle *)0x1165dc;
      sVar5 = strlen((char *)&afStack_900[10].custom_cmp_param);
      pfStack_d78 = (fdb_kvs_handle *)0x1165ef;
      sVar6 = strlen(&afStack_900[0].create_if_missing);
      pfStack_d78 = (fdb_kvs_handle *)0x1165fc;
      sVar7 = strlen((char *)afStack_d20);
      pfStack_d78 = (fdb_kvs_handle *)0x11661e;
      fdb_doc_create((fdb_doc **)(&fStack_c20.kvs_config.create_if_missing + lVar17),
                     &afStack_900[10].custom_cmp_param,sVar5,afStack_900,sVar6,afStack_d20,sVar7);
      pfStack_d78 = (fdb_kvs_handle *)0x116630;
      fdb_set((fdb_kvs_handle *)auStack_d68._8_8_,
              *(fdb_doc **)(&fStack_c20.kvs_config.create_if_missing + uVar18 * 8));
      uVar18 = uVar18 + 1;
      lVar17 = lVar17 + 8;
    } while (uVar18 != 100);
    pfStack_d78 = (fdb_kvs_handle *)0x11664d;
    fdb_commit((fdb_file_handle *)auStack_d58._0_8_,'\0');
    config_00 = afStack_900;
    unaff_R12 = afStack_d20;
    pfVar8 = (fdb_doc *)0x0;
    uVar18 = 0;
    do {
      pfStack_d78 = (fdb_kvs_handle *)0x116674;
      sprintf(&config_00->create_if_missing,"meta2%d",uVar18 & 0xffffffff);
      pfStack_d78 = (fdb_kvs_handle *)0x116688;
      sprintf((char *)unaff_R12,"body2%d",uVar18 & 0xffffffff);
      unaff_RBP = (fdb_kvs_handle *)(&fStack_c20.kvs_config.create_if_missing + (long)pfVar8);
      pfStack_d78 = (fdb_kvs_handle *)0x11669b;
      sVar5 = strlen(&config_00->create_if_missing);
      pfStack_d78 = (fdb_kvs_handle *)0x1166a6;
      sVar6 = strlen((char *)unaff_R12);
      pfStack_d78 = (fdb_kvs_handle *)0x1166ba;
      fdb_doc_update((fdb_doc **)unaff_RBP,config_00,sVar5,unaff_R12,sVar6);
      pfStack_d78 = (fdb_kvs_handle *)0x1166cc;
      fdb_set((fdb_kvs_handle *)auStack_d68._8_8_,
              *(fdb_doc **)(&fStack_c20.kvs_config.create_if_missing + uVar18 * 8));
      uVar18 = uVar18 + 1;
      pfVar8 = (fdb_doc *)((long)pfVar8 + 8);
    } while (uVar18 != 0x32);
    pfVar13 = (fdb_doc *)auStack_d68;
    pfStack_d78 = (fdb_kvs_handle *)0x116708;
    fdb_doc_create((fdb_doc **)pfVar13,
                   *(void **)((long)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i
                             + 0x20),
                   *(size_t *)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i,
                   *(void **)((long)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i
                             + 0x38),
                   *(size_t *)
                    ((long)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i + 8),
                   (void *)0x0,0);
    pfStack_d78 = (fdb_kvs_handle *)0x116715;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_d68._8_8_,(fdb_doc *)auStack_d68._0_8_);
    unaff_R13 = (fdb_kvs_handle *)0x32;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a3e;
    pfVar13 = (fdb_doc *)auStack_d68;
    pfStack_d78 = (fdb_kvs_handle *)0x11672a;
    fdb_doc_free((fdb_doc *)auStack_d68._0_8_);
    config_00 = (fdb_kvs_config *)0x0;
    auStack_d68._0_8_ = (fdb_doc *)0x0;
    pfStack_d78 = (fdb_kvs_handle *)0x11673c;
    fdb_commit((fdb_file_handle *)auStack_d58._0_8_,'\0');
    pfStack_d78 = (fdb_kvs_handle *)0x11675f;
    fdb_doc_create((fdb_doc **)pfVar13,*(void **)&(fStack_c20.fhandle)->lock,
                   (size_t)(fStack_c20.fhandle)->root,(void *)0x0,0,(void *)0x0,0);
    pfStack_d78 = (fdb_kvs_handle *)0x11676c;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_d68._8_8_,(fdb_doc *)auStack_d68._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a43;
    if (*(bool *)(auStack_d68._0_8_ + 0x48) != false) {
      pfStack_d78 = (fdb_kvs_handle *)0x116789;
      read_doc_by_offset_test();
    }
    pfVar13 = (fdb_doc *)auStack_d68._0_8_;
    config_00 = *(fdb_kvs_config **)(auStack_d68._0_8_ + 0x38);
    pfVar8 = (fdb_doc *)fStack_c20.fhandle[1].cmp_func_list;
    pfStack_d78 = (fdb_kvs_handle *)0x1167ad;
    iVar4 = bcmp(config_00,pfVar8,*(size_t *)(auStack_d68._0_8_ + 8));
    if (iVar4 != 0) goto LAB_00116a48;
    pfStack_d78 = (fdb_kvs_handle *)0x1167c2;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d68._8_8_,pfVar13);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a53;
    if (*(bool *)(auStack_d68._0_8_ + 0x48) != false) {
      pfStack_d78 = (fdb_kvs_handle *)0x1167df;
      read_doc_by_offset_test();
    }
    unaff_R12 = fStack_c20.fhandle;
    pfVar8 = (fdb_doc *)auStack_d68._0_8_;
    pfVar13 = *(fdb_doc **)(auStack_d68._0_8_ + 0x38);
    config_00 = (fdb_kvs_config *)fStack_c20.fhandle[1].cmp_func_list;
    pfStack_d78 = (fdb_kvs_handle *)0x116804;
    iVar4 = bcmp(pfVar13,config_00,(size_t)*(list_elem **)(auStack_d68._0_8_ + 8));
    if (iVar4 != 0) goto LAB_00116a58;
    pfVar13 = *(fdb_doc **)((long)pfVar8 + 0x40);
    config_00 = (fdb_kvs_config *)unaff_R12[1].flags;
    pfStack_d78 = (fdb_kvs_handle *)0x116824;
    iVar4 = bcmp(pfVar13,config_00,*(size_t *)((long)pfVar8 + 0x10));
    if (iVar4 != 0) goto LAB_00116a63;
    pfVar13 = (fdb_doc *)(auStack_d58 + 8);
    pfStack_d78 = (fdb_kvs_handle *)0x11684d;
    fdb_doc_create((fdb_doc **)pfVar13,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    *(uint64_t *)(auStack_d58._8_8_ + 0x30) = *(uint64_t *)(auStack_d68._0_8_ + 0x30);
    pfStack_d78 = (fdb_kvs_handle *)0x116867;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d68._8_8_,(fdb_doc *)auStack_d58._8_8_);
    pfVar20 = (fdb_doc *)auStack_d58._8_8_;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a6e;
    pfVar13 = *(fdb_doc **)(auStack_d58._8_8_ + 0x20);
    config_00 = *(fdb_kvs_config **)&(fStack_c20.fhandle)->lock;
    pfStack_d78 = (fdb_kvs_handle *)0x116893;
    iVar4 = bcmp(pfVar13,config_00,(size_t)*(list_elem **)auStack_d58._8_8_);
    unaff_R12 = fStack_c20.fhandle;
    if (iVar4 != 0) goto LAB_00116a73;
    pfVar13 = *(fdb_doc **)((long)pfVar20 + 0x38);
    config_00 = (fdb_kvs_config *)fStack_c20.fhandle[1].cmp_func_list;
    pfStack_d78 = (fdb_kvs_handle *)0x1168b3;
    iVar4 = bcmp(pfVar13,config_00,(size_t)*(list_elem **)((long)pfVar20 + 8));
    if (iVar4 != 0) goto LAB_00116a7e;
    pfVar13 = *(fdb_doc **)((long)pfVar20 + 0x40);
    config_00 = (fdb_kvs_config *)fStack_c20.fhandle[1].flags;
    pfStack_d78 = (fdb_kvs_handle *)0x1168d3;
    iVar4 = bcmp(pfVar13,config_00,*(size_t *)((long)pfVar20 + 0x10));
    if (iVar4 != 0) goto LAB_00116a89;
    pfVar13 = (fdb_doc *)auStack_d68;
    pfStack_d78 = (fdb_kvs_handle *)0x1168e8;
    fdb_doc_free((fdb_doc *)auStack_d68._0_8_);
    config_00 = (fdb_kvs_config *)0x0;
    auStack_d68._0_8_ = (fdb_doc *)0x0;
    pfStack_d78 = (fdb_kvs_handle *)0x1168f8;
    fdb_doc_free((fdb_doc *)auStack_d58._8_8_);
    pfStack_d78 = (fdb_kvs_handle *)0x116909;
    fdb_compact((fdb_file_handle *)auStack_d58._0_8_,"./dummy2");
    pfStack_d78 = (fdb_kvs_handle *)0x11692c;
    fdb_doc_create((fdb_doc **)pfVar13,
                   *(void **)((long)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i
                             + 0x20),
                   *(size_t *)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_d78 = (fdb_kvs_handle *)0x116939;
    fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_d68._8_8_,(fdb_doc *)auStack_d68._0_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116a94;
    if (*(bool *)(auStack_d68._0_8_ + 0x48) == false) {
      pfStack_d78 = (fdb_kvs_handle *)0x116956;
      read_doc_by_offset_test();
    }
    pfVar13 = (fdb_doc *)auStack_d68._0_8_;
    config_00 = *(fdb_kvs_config **)(auStack_d68._0_8_ + 0x38);
    pfVar20 = *(fdb_doc **)
               ((long)fStack_c20.last_hdr_bid.super___atomic_base<unsigned_long>._M_i + 0x38);
    pfStack_d78 = (fdb_kvs_handle *)0x11697a;
    iVar4 = bcmp(config_00,pfVar20,*(size_t *)(auStack_d68._0_8_ + 8));
    if (iVar4 != 0) goto LAB_00116a99;
    pfStack_d78 = (fdb_kvs_handle *)0x11698f;
    fVar3 = fdb_get_byoffset((fdb_kvs_handle *)auStack_d68._8_8_,pfVar13);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      if (*(bool *)(auStack_d68._0_8_ + 0x48) == false) {
        pfStack_d78 = (fdb_kvs_handle *)0x1169ad;
        read_doc_by_offset_test();
      }
      pfStack_d78 = (fdb_kvs_handle *)0x1169b7;
      fdb_doc_free((fdb_doc *)auStack_d68._0_8_);
      auStack_d68._0_8_ = 0;
      lVar17 = 0;
      do {
        pfStack_d78 = (fdb_kvs_handle *)0x1169cf;
        fdb_doc_free(*(fdb_doc **)(&fStack_c20.kvs_config.create_if_missing + lVar17 * 8));
        lVar17 = lVar17 + 1;
      } while (lVar17 != 100);
      pfStack_d78 = (fdb_kvs_handle *)0x1169e2;
      fdb_kvs_close((fdb_kvs_handle *)auStack_d68._8_8_);
      pfStack_d78 = (fdb_kvs_handle *)0x1169ec;
      fdb_close((fdb_file_handle *)auStack_d58._0_8_);
      pfStack_d78 = (fdb_kvs_handle *)0x1169f1;
      fdb_shutdown();
      pfStack_d78 = (fdb_kvs_handle *)0x1169f6;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (read_doc_by_offset_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_d78 = (fdb_kvs_handle *)0x116a27;
      fprintf(_stderr,pcVar16,"read_doc_by_offset test");
      return;
    }
  }
  else {
    pfStack_d78 = (fdb_kvs_handle *)0x116a3e;
    read_doc_by_offset_test();
LAB_00116a3e:
    pfStack_d78 = (fdb_kvs_handle *)0x116a43;
    read_doc_by_offset_test();
LAB_00116a43:
    pfStack_d78 = (fdb_kvs_handle *)0x116a48;
    read_doc_by_offset_test();
LAB_00116a48:
    pfStack_d78 = (fdb_kvs_handle *)0x116a53;
    read_doc_by_offset_test();
LAB_00116a53:
    pfStack_d78 = (fdb_kvs_handle *)0x116a58;
    read_doc_by_offset_test();
LAB_00116a58:
    pfStack_d78 = (fdb_kvs_handle *)0x116a63;
    read_doc_by_offset_test();
LAB_00116a63:
    pfStack_d78 = (fdb_kvs_handle *)0x116a6e;
    read_doc_by_offset_test();
LAB_00116a6e:
    pfVar20 = pfVar8;
    pfStack_d78 = (fdb_kvs_handle *)0x116a73;
    read_doc_by_offset_test();
LAB_00116a73:
    pfStack_d78 = (fdb_kvs_handle *)0x116a7e;
    read_doc_by_offset_test();
LAB_00116a7e:
    pfStack_d78 = (fdb_kvs_handle *)0x116a89;
    read_doc_by_offset_test();
LAB_00116a89:
    pfStack_d78 = (fdb_kvs_handle *)0x116a94;
    read_doc_by_offset_test();
LAB_00116a94:
    pfStack_d78 = (fdb_kvs_handle *)0x116a99;
    read_doc_by_offset_test();
LAB_00116a99:
    pfStack_d78 = (fdb_kvs_handle *)0x116aa4;
    read_doc_by_offset_test();
  }
  pfStack_d78 = (fdb_kvs_handle *)purge_logically_deleted_doc_test;
  read_doc_by_offset_test();
  pfStack_1240 = (fdb_kvs_handle *)0x116ac9;
  pfStack_da0 = pfVar13;
  pfStack_d98 = unaff_R12;
  pfStack_d90 = unaff_R13;
  pfStack_d88 = config_00;
  pfStack_d80 = pfVar20;
  pfStack_d78 = unaff_RBP;
  gettimeofday(&tStack_11c0,(__timezone_ptr_t)0x0);
  pfStack_1240 = (fdb_kvs_handle *)0x116ace;
  memleak_start();
  auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
  pfStack_1240 = (fdb_kvs_handle *)0x116adf;
  system("rm -rf  dummy* fdb_test_config.json > errorlog.txt");
  pfStack_1240 = (fdb_kvs_handle *)0x116aef;
  fdb_get_default_config();
  pfVar8 = afStack_11b0;
  pfStack_1240 = (fdb_kvs_handle *)0x116aff;
  fdb_get_default_kvs_config();
  uStack_e90 = 0;
  uStack_e88 = 0x400;
  uStack_e74 = 1;
  uStack_e7c = 2;
  uStack_e69 = 0;
  doc_01 = (list *)auStack_1220;
  pfStack_1240 = (fdb_kvs_handle *)0x116b34;
  fdb_open((fdb_file_handle **)doc_01,"./dummy1",(fdb_config *)(auStack_1098 + 0x200));
  ptr_handle = (fdb_file_handle *)(auStack_1230 + 8);
  pfStack_1240 = (fdb_kvs_handle *)0x116b47;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_1220._0_8_,(fdb_kvs_handle **)ptr_handle,
             (fdb_kvs_config *)pfVar8);
  pfStack_1240 = (fdb_kvs_handle *)0x116b5d;
  fVar3 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1230._8_8_,logCallbackFunc,
                     "purge_logically_deleted_doc_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    unaff_R12 = (fdb_file_handle *)0x0;
    uVar18 = 0;
    do {
      pfStack_1240 = (fdb_kvs_handle *)0x116b85;
      sprintf(auStack_1098 + 0x100,"key%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_kvs_handle *)0x116b9d;
      sprintf(auStack_1098,"meta%d",uVar18 & 0xffffffff);
      pfStack_1240 = (fdb_kvs_handle *)0x116bb5;
      sprintf((char *)&afStack_11b0[0].size_ondisk,"body%d",uVar18 & 0xffffffff);
      doc_01 = (list *)(auStack_1220 + (long)unaff_R12 + 8);
      pfStack_1240 = (fdb_kvs_handle *)0x116bc5;
      unaff_R13 = (fdb_kvs_handle *)strlen(auStack_1098 + 0x100);
      unaff_RBP = (fdb_kvs_handle *)auStack_1098;
      pfStack_1240 = (fdb_kvs_handle *)0x116bd8;
      pfVar8 = (fdb_doc *)strlen((char *)unaff_RBP);
      pfStack_1240 = (fdb_kvs_handle *)0x116be8;
      sVar5 = strlen((char *)&afStack_11b0[0].size_ondisk);
      pfStack_1240 = (fdb_kvs_handle *)0x116c0d;
      fdb_doc_create((fdb_doc **)doc_01,auStack_1098 + 0x100,(size_t)unaff_R13,unaff_RBP,
                     (size_t)pfVar8,&afStack_11b0[0].size_ondisk,sVar5);
      pfStack_1240 = (fdb_kvs_handle *)0x116c1c;
      fdb_set((fdb_kvs_handle *)auStack_1230._8_8_,*(fdb_doc **)(auStack_1220 + uVar18 * 8 + 8));
      uVar18 = uVar18 + 1;
      unaff_R12 = (fdb_file_handle *)((long)unaff_R12 + 8);
    } while (uVar18 != 10);
    ptr_handle = (fdb_file_handle *)auStack_1230;
    pfStack_1240 = (fdb_kvs_handle *)0x116c59;
    fdb_doc_create((fdb_doc **)ptr_handle,(void *)psStack_11f0[4],*psStack_11f0,
                   (void *)psStack_11f0[7],psStack_11f0[1],(void *)0x0,0);
    pfStack_1240 = (fdb_kvs_handle *)0x116c66;
    fVar3 = fdb_del((fdb_kvs_handle *)auStack_1230._8_8_,(fdb_doc *)auStack_1230._0_8_);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      ptr_handle = (fdb_file_handle *)auStack_1230;
      pfStack_1240 = (fdb_kvs_handle *)0x116c7b;
      fdb_doc_free((fdb_doc *)auStack_1230._0_8_);
      auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
      pfStack_1240 = (fdb_kvs_handle *)0x116c91;
      fdb_commit((fdb_file_handle *)auStack_1220._0_8_,'\0');
      pfStack_1240 = (fdb_kvs_handle *)0x116ca2;
      fdb_compact((fdb_file_handle *)auStack_1220._0_8_,"./dummy2");
      unaff_R13 = (fdb_kvs_handle *)0x0;
      pfVar9 = unaff_RBP;
      do {
        pfStack_1240 = (fdb_kvs_handle *)0x116cc9;
        fdb_doc_create((fdb_doc **)ptr_handle,
                       (void *)(*(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8))[4],
                       **(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_1240 = (fdb_kvs_handle *)0x116cd8;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_1230._8_8_,(fdb_doc *)auStack_1230._0_8_);
        unaff_RBP = (fdb_kvs_handle *)auStack_1230._0_8_;
        if (unaff_R13 != (fdb_kvs_handle *)0x5) {
          if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00116f87:
            pfStack_1240 = (fdb_kvs_handle *)0x116f8c;
            purge_logically_deleted_doc_test();
            unaff_RBP = pfVar9;
            goto LAB_00116f8c;
          }
          pfVar8 = *(fdb_doc **)(auStack_1230._0_8_ + 0x38);
          doc = *(fdb_file_handle **)(auStack_1220 + (long)unaff_R13 * 8 + 8);
          doc_01 = doc[1].cmp_func_list;
          pfStack_1240 = (fdb_kvs_handle *)0x116d14;
          iVar4 = bcmp(pfVar8,doc_01,(size_t)((fdb_kvs_config *)auStack_1230._0_8_)->custom_cmp);
          unaff_R12 = ptr_handle;
          if (iVar4 == 0) {
            pfVar8 = (fdb_doc *)
                     ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)unaff_RBP + 0x40))->
                     seqtree;
            doc_01 = (list *)doc[1].flags;
            pfStack_1240 = (fdb_kvs_handle *)0x116d33;
            iVar4 = bcmp(pfVar8,doc_01,(size_t)(unaff_RBP->kvs_config).custom_cmp_param);
            if (iVar4 == 0) goto LAB_00116d44;
LAB_00116f7c:
            pfStack_1240 = (fdb_kvs_handle *)0x116f87;
            purge_logically_deleted_doc_test();
            pfVar9 = unaff_RBP;
            goto LAB_00116f87;
          }
LAB_00116f91:
          pfStack_1240 = (fdb_kvs_handle *)0x116f9c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f9c;
        }
        unaff_RBP = pfVar9;
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) {
LAB_00116f8c:
          pfStack_1240 = (fdb_kvs_handle *)0x116f91;
          purge_logically_deleted_doc_test();
          doc = ptr_handle;
          unaff_R12 = (fdb_file_handle *)0x0;
          goto LAB_00116f91;
        }
LAB_00116d44:
        unaff_R12 = (fdb_file_handle *)0x0;
        pfStack_1240 = (fdb_kvs_handle *)0x116d4e;
        fdb_doc_free((fdb_doc *)auStack_1230._0_8_);
        auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
        pfStack_1240 = (fdb_kvs_handle *)0x116d73;
        fdb_doc_create((fdb_doc **)ptr_handle,
                       (void *)(*(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8))[4],
                       **(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_1240 = (fdb_kvs_handle *)0x116d82;
        fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1230._8_8_,(fdb_doc *)auStack_1230._0_8_)
        ;
        if (unaff_R13 == (fdb_kvs_handle *)0x5) {
          if ((fVar3 != FDB_RESULT_KEY_NOT_FOUND) && (fVar3 != FDB_RESULT_SUCCESS))
          goto LAB_00116fc6;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) {
          pfStack_1240 = (fdb_kvs_handle *)0x116f7c;
          purge_logically_deleted_doc_test();
          goto LAB_00116f7c;
        }
        pfStack_1240 = (fdb_kvs_handle *)0x116da8;
        fdb_doc_free((fdb_doc *)auStack_1230._0_8_);
        auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
        pfVar9 = unaff_RBP;
      } while (unaff_R13 != (fdb_kvs_handle *)0xa);
      pfStack_1240 = (fdb_kvs_handle *)0x116dca;
      puts("wait for 3 seconds..");
      pfStack_1240 = (fdb_kvs_handle *)0x116dd4;
      sleep(3);
      pfStack_1240 = (fdb_kvs_handle *)0x116de5;
      fdb_compact((fdb_file_handle *)auStack_1220._0_8_,"./dummy3");
      doc = (fdb_file_handle *)auStack_1230;
      unaff_R13 = (fdb_kvs_handle *)0x0;
      do {
        unaff_R12 = (fdb_file_handle *)0x0;
        pfStack_1240 = (fdb_kvs_handle *)0x116e14;
        fdb_doc_create((fdb_doc **)doc,
                       (void *)(*(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8))[4],
                       **(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_1240 = (fdb_kvs_handle *)0x116e23;
        fVar3 = fdb_get((fdb_kvs_handle *)auStack_1230._8_8_,(fdb_doc *)auStack_1230._0_8_);
        pfVar9 = (fdb_kvs_handle *)auStack_1230._0_8_;
        if (unaff_R13 == (fdb_kvs_handle *)0x5) {
          pfVar9 = unaff_RBP;
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa1;
        }
        else {
          if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116f9c;
          pfVar8 = *(fdb_doc **)(auStack_1230._0_8_ + 0x38);
          unaff_R12 = *(fdb_file_handle **)(auStack_1220 + (long)unaff_R13 * 8 + 8);
          doc_01 = unaff_R12[1].cmp_func_list;
          pfStack_1240 = (fdb_kvs_handle *)0x116e5d;
          iVar4 = bcmp(pfVar8,doc_01,(size_t)((fdb_kvs_config *)auStack_1230._0_8_)->custom_cmp);
          if (iVar4 != 0) goto LAB_00116fab;
          pfVar8 = (fdb_doc *)
                   ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)pfVar9 + 0x40))->seqtree
          ;
          doc_01 = (list *)unaff_R12[1].flags;
          pfStack_1240 = (fdb_kvs_handle *)0x116e7d;
          iVar4 = bcmp(pfVar8,doc_01,(size_t)(pfVar9->kvs_config).custom_cmp_param);
          unaff_R12 = (fdb_file_handle *)0x0;
          if (iVar4 != 0) goto LAB_00116fbb;
        }
        unaff_R12 = (fdb_file_handle *)0x0;
        pfStack_1240 = (fdb_kvs_handle *)0x116e95;
        fdb_doc_free((fdb_doc *)auStack_1230._0_8_);
        auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
        pfStack_1240 = (fdb_kvs_handle *)0x116eba;
        fdb_doc_create((fdb_doc **)doc,
                       (void *)(*(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8))[4],
                       **(size_t **)(auStack_1220 + (long)unaff_R13 * 8 + 8),(void *)0x0,0,
                       (void *)0x0,0);
        pfStack_1240 = (fdb_kvs_handle *)0x116ec9;
        fVar3 = fdb_get_metaonly((fdb_kvs_handle *)auStack_1230._8_8_,(fdb_doc *)auStack_1230._0_8_)
        ;
        if (unaff_R13 == (fdb_kvs_handle *)0x5) {
          if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_00116fa6;
        }
        else if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00116fb6;
        pfStack_1240 = (fdb_kvs_handle *)0x116eeb;
        fdb_doc_free((fdb_doc *)auStack_1230._0_8_);
        auStack_1230._0_8_ = (fdb_kvs_handle *)0x0;
        unaff_R13 = (fdb_kvs_handle *)&(unaff_R13->kvs_config).field_0x1;
        unaff_RBP = pfVar9;
        if (unaff_R13 == (fdb_kvs_handle *)0xa) {
          pfStack_1240 = (fdb_kvs_handle *)0x116f0b;
          fdb_kvs_close((fdb_kvs_handle *)auStack_1230._8_8_);
          pfStack_1240 = (fdb_kvs_handle *)0x116f15;
          fdb_close((fdb_file_handle *)auStack_1220._0_8_);
          lVar17 = 0;
          do {
            pfStack_1240 = (fdb_kvs_handle *)0x116f21;
            fdb_doc_free(*(fdb_doc **)(auStack_1220 + lVar17 * 8 + 8));
            lVar17 = lVar17 + 1;
          } while (lVar17 != 10);
          pfStack_1240 = (fdb_kvs_handle *)0x116f2f;
          fdb_shutdown();
          pfStack_1240 = (fdb_kvs_handle *)0x116f34;
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (purge_logically_deleted_doc_test()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          pfStack_1240 = (fdb_kvs_handle *)0x116f65;
          fprintf(_stderr,pcVar16,"purge logically deleted doc test");
          return;
        }
      } while( true );
    }
  }
  else {
LAB_00116fcb:
    pfStack_1240 = (fdb_kvs_handle *)0x116fd0;
    purge_logically_deleted_doc_test();
  }
  pfStack_1240 = (fdb_kvs_handle *)api_wrapper_test;
  purge_logically_deleted_doc_test();
  pfStack_16c8 = (fdb_kvs_handle *)0x116ff2;
  pfStack_1268 = ptr_handle;
  pfStack_1260 = unaff_R12;
  pfStack_1258 = unaff_R13;
  pfStack_1250 = pfVar8;
  plStack_1248 = doc_01;
  pfStack_1240 = unaff_RBP;
  gettimeofday((timeval *)(auStack_16a8 + 0x10),(__timezone_ptr_t)0x0);
  pfStack_16c8 = (fdb_kvs_handle *)0x116ff7;
  memleak_start();
  pfStack_16c8 = (fdb_kvs_handle *)0x117003;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_16c8 = (fdb_kvs_handle *)0x117013;
  fdb_get_default_config();
  pfVar19 = (fdb_kvs_handle *)auStack_1688;
  pfStack_16c8 = (fdb_kvs_handle *)0x117020;
  fdb_get_default_kvs_config();
  auStack_1570[0x110] = '\0';
  auStack_1570[0x111] = '\0';
  auStack_1570[0x112] = '\0';
  auStack_1570[0x113] = '\0';
  auStack_1570[0x114] = '\0';
  auStack_1570[0x115] = '\0';
  auStack_1570[0x116] = '\0';
  auStack_1570[0x117] = '\0';
  auStack_1570[0x118] = '\0';
  auStack_1570[0x119] = '\x04';
  auStack_1570[0x11a] = '\0';
  auStack_1570[0x11b] = '\0';
  auStack_1570[0x11c] = '\0';
  auStack_1570[0x11d] = '\0';
  auStack_1570[0x11e] = '\0';
  auStack_1570[0x11f] = '\0';
  auStack_1570._300_4_ = 1;
  auStack_1570._292_4_ = 0;
  auStack_1570[0x137] = 0;
  pcVar16 = auStack_16a8 + 8;
  pfStack_16c8 = (fdb_kvs_handle *)0x117059;
  fdb_open((fdb_file_handle **)pcVar16,"./dummy1",(fdb_config *)(auStack_1570 + 0x108));
  pfVar9 = (fdb_kvs_handle *)&pfStack_16b8;
  pfStack_16c8 = (fdb_kvs_handle *)0x11706c;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_16a8._8_8_,(fdb_kvs_handle **)pfVar9,
             (fdb_kvs_config *)pfVar19);
  pfStack_16c8 = (fdb_kvs_handle *)0x117082;
  fVar3 = fdb_set_log_callback(pfStack_16b8,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_16c8 = (fdb_kvs_handle *)0x11709d;
    fVar3 = fdb_set_kv(pfStack_16b8,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172ef;
    pcVar22 = auStack_1688 + 0x18;
    pcVar16 = "body%d";
    unaff_R12 = (fdb_file_handle *)(auStack_1570 + 0x200);
    unaff_RBP = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16c8 = (fdb_kvs_handle *)0x1170cf;
      sprintf(pcVar22,"key%d",unaff_RBP);
      pfStack_16c8 = (fdb_kvs_handle *)0x1170de;
      sprintf((char *)unaff_R12,"body%d",unaff_RBP);
      unaff_R13 = pfStack_16b8;
      pfStack_16c8 = (fdb_kvs_handle *)0x1170eb;
      pfVar9 = (fdb_kvs_handle *)strlen(pcVar22);
      pfStack_16c8 = (fdb_kvs_handle *)0x1170f6;
      sVar5 = strlen((char *)unaff_R12);
      pfStack_16c8 = (fdb_kvs_handle *)0x11710a;
      fVar3 = fdb_set_kv(unaff_R13,pcVar22,(size_t)pfVar9,unaff_R12,sVar5);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_16c8 = (fdb_kvs_handle *)0x1172d0;
        api_wrapper_test();
        goto LAB_001172d0;
      }
      uVar14 = (int)unaff_RBP + 1;
      unaff_RBP = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar14 != 10);
    pfVar9 = (fdb_kvs_handle *)(auStack_1688 + 0x18);
    pfStack_16c8 = (fdb_kvs_handle *)0x117134;
    sprintf((char *)pfVar9,"key%d",5);
    pfVar19 = pfStack_16b8;
    pfStack_16c8 = (fdb_kvs_handle *)0x117141;
    sVar5 = strlen((char *)pfVar9);
    pfStack_16c8 = (fdb_kvs_handle *)0x11714f;
    fVar3 = fdb_del_kv(pfVar19,pfVar9,sVar5);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172f4;
    pfStack_16c8 = (fdb_kvs_handle *)0x117165;
    fVar3 = fdb_del_kv(pfStack_16b8,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172f9;
    pfVar19 = (fdb_kvs_handle *)(auStack_1688 + 0x18);
    pcVar16 = (char *)&pfStack_16b0;
    unaff_R12 = (fdb_file_handle *)auStack_16a8;
    unaff_RBP = (fdb_kvs_handle *)auStack_1570;
    unaff_R13 = (fdb_kvs_handle *)0x0;
    do {
      pfStack_16c8 = (fdb_kvs_handle *)0x11719c;
      sprintf((char *)pfVar19,"key%d",unaff_R13);
      pfVar9 = pfStack_16b8;
      pfStack_16c8 = (fdb_kvs_handle *)0x1171a9;
      sVar5 = strlen((char *)pfVar19);
      pfStack_16c8 = (fdb_kvs_handle *)0x1171bd;
      fVar3 = fdb_get_kv(pfVar9,pfVar19,sVar5,(void **)pcVar16,(size_t *)unaff_R12);
      if ((int)unaff_R13 == 5) {
        if (fVar3 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001172e5;
      }
      else {
        if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001172e0;
        pfStack_16c8 = (fdb_kvs_handle *)0x1171e9;
        sprintf((char *)unaff_RBP,"body%d",unaff_R13);
        pfVar9 = pfStack_16b0;
        pfStack_16c8 = (fdb_kvs_handle *)0x1171fe;
        iVar4 = bcmp(pfStack_16b0,unaff_RBP,auStack_16a8._0_8_);
        if (iVar4 != 0) goto LAB_001172d0;
        pfStack_16c8 = (fdb_kvs_handle *)0x11720e;
        fdb_free_block(pfVar9);
      }
      uVar14 = (int)unaff_R13 + 1;
      unaff_R13 = (fdb_kvs_handle *)(ulong)uVar14;
    } while (uVar14 != 10);
    pfStack_16c8 = (fdb_kvs_handle *)0x117233;
    fVar3 = fdb_get_kv(pfStack_16b8,(void *)0x0,0,&pfStack_16b0,(size_t *)auStack_16a8);
    handle = pfStack_16b8;
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_001172fe;
    pfVar19 = (fdb_kvs_handle *)(auStack_1688 + 0x18);
    pfStack_16c8 = (fdb_kvs_handle *)0x11724e;
    sVar5 = strlen((char *)pfVar19);
    pfStack_16c8 = (fdb_kvs_handle *)0x117261;
    fVar3 = fdb_get_kv(handle,pfVar19,sVar5,(void **)0x0,(size_t *)0x0);
    if (fVar3 == FDB_RESULT_INVALID_ARGS) {
      pfStack_16c8 = (fdb_kvs_handle *)0x117274;
      fdb_kvs_close(pfStack_16b8);
      pfStack_16c8 = (fdb_kvs_handle *)0x11727e;
      fdb_close((fdb_file_handle *)auStack_16a8._8_8_);
      pfStack_16c8 = (fdb_kvs_handle *)0x117283;
      fdb_shutdown();
      pfStack_16c8 = (fdb_kvs_handle *)0x117288;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (api_wrapper_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_16c8 = (fdb_kvs_handle *)0x1172b9;
      fprintf(_stderr,pcVar16,"API wrapper test");
      return;
    }
  }
  else {
LAB_001172ea:
    pfStack_16c8 = (fdb_kvs_handle *)0x1172ef;
    api_wrapper_test();
LAB_001172ef:
    pfStack_16c8 = (fdb_kvs_handle *)0x1172f4;
    api_wrapper_test();
LAB_001172f4:
    pfStack_16c8 = (fdb_kvs_handle *)0x1172f9;
    api_wrapper_test();
LAB_001172f9:
    pfStack_16c8 = (fdb_kvs_handle *)0x1172fe;
    api_wrapper_test();
LAB_001172fe:
    handle = pfVar9;
    pfStack_16c8 = (fdb_kvs_handle *)0x117303;
    api_wrapper_test();
  }
  pfStack_16c8 = (fdb_kvs_handle *)flush_before_commit_test;
  api_wrapper_test();
  pfStack_1c50 = (fdb_kvs_handle *)0x117325;
  pfStack_16f0 = handle;
  pfStack_16e8 = unaff_R12;
  pfStack_16e0 = unaff_R13;
  pfStack_16d8 = pfVar19;
  ppfStack_16d0 = (fdb_kvs_handle **)pcVar16;
  pfStack_16c8 = unaff_RBP;
  gettimeofday(&tStack_1c18,(__timezone_ptr_t)0x0);
  pfStack_1c50 = (fdb_kvs_handle *)0x11732a;
  memleak_start();
  pfStack_1c50 = (fdb_kvs_handle *)0x117336;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1c50 = (fdb_kvs_handle *)0x117346;
  fdb_get_default_config();
  pfStack_1c50 = (fdb_kvs_handle *)0x117356;
  fdb_get_default_kvs_config();
  fStack_19f0.buffercache_size = 0;
  fStack_19f0.wal_threshold = 5;
  fStack_19f0.flags = 1;
  fStack_19f0.purging_interval = 0;
  fStack_19f0.compaction_threshold = '\0';
  fStack_19f0.wal_flush_before_commit = true;
  pfStack_1c50 = (fdb_kvs_handle *)0x11739a;
  fdb_open(&pfStack_1c30,"dummy1",&fStack_19f0);
  pfStack_1c50 = (fdb_kvs_handle *)0x1173ad;
  fdb_open(&pfStack_1c38,"dummy1",&fStack_19f0);
  pfStack_1c50 = (fdb_kvs_handle *)0x1173be;
  fdb_kvs_open_default(pfStack_1c30,&pfStack_1c20,&fStack_1b10);
  pfStack_1c50 = (fdb_kvs_handle *)0x1173d2;
  fdb_kvs_open_default(pfStack_1c38,&pfStack_1c28,&fStack_1b10);
  pfStack_1c50 = (fdb_kvs_handle *)0x1173e8;
  fVar3 = fdb_set_log_callback(pfStack_1c28,logCallbackFunc,"flush_before_commit_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    ppfVar12 = apfStack_1c08;
    uVar18 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117414;
      sprintf(acStack_1af8,"key%d",uVar18 & 0xffffffff);
      pfStack_1c50 = (fdb_kvs_handle *)0x117430;
      sprintf(acStack_17f8,"meta%d",uVar18 & 0xffffffff);
      pfStack_1c50 = (fdb_kvs_handle *)0x11744c;
      sprintf(acStack_18f8,"body%d",uVar18 & 0xffffffff);
      pfStack_1c50 = (fdb_kvs_handle *)0x117454;
      sVar5 = strlen(acStack_1af8);
      pfStack_1c50 = (fdb_kvs_handle *)0x11745f;
      sVar6 = strlen(acStack_17f8);
      pfStack_1c50 = (fdb_kvs_handle *)0x11746a;
      sVar7 = strlen(acStack_18f8);
      pfStack_1c50 = (fdb_kvs_handle *)0x11748a;
      fdb_doc_create(ppfVar12,acStack_1af8,sVar5,acStack_17f8,sVar6,acStack_18f8,sVar7);
      uVar18 = uVar18 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar18 != 0x1e);
    pfStack_1c50 = (fdb_kvs_handle *)0x1174aa;
    fdb_begin_transaction(pfStack_1c38,'\x02');
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1174bb;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x1174d2;
    fdb_commit(pfStack_1c30,'\0');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1174e1;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x1174f8;
    fdb_end_transaction(pfStack_1c38,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x117507;
    fdb_commit(pfStack_1c30,'\x01');
    pfStack_1c50 = (fdb_kvs_handle *)0x117516;
    fdb_begin_transaction(pfStack_1c38,'\x02');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117525;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x11753c;
    fdb_end_transaction(pfStack_1c38,'\0');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x11754b;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x117562;
    fdb_commit(pfStack_1c30,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x117571;
    fdb_commit(pfStack_1c30,'\x01');
    pfStack_1c50 = (fdb_kvs_handle *)0x117580;
    fdb_begin_transaction(pfStack_1c38,'\x02');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x11758f;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1175a9;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x1175c0;
    fdb_commit(pfStack_1c30,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x1175cc;
    fdb_end_transaction(pfStack_1c38,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x1175db;
    fdb_commit(pfStack_1c30,'\x01');
    pfStack_1c50 = (fdb_kvs_handle *)0x1175ea;
    fdb_begin_transaction(pfStack_1c38,'\x02');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1175f9;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117613;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 == 1);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x11762a;
    fdb_end_transaction(pfStack_1c38,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x117636;
    fdb_commit(pfStack_1c30,'\0');
    pfStack_1c50 = (fdb_kvs_handle *)0x117645;
    fdb_commit(pfStack_1c30,'\x01');
    pfStack_1c50 = (fdb_kvs_handle *)0x117654;
    fdb_begin_transaction(pfStack_1c38,'\x02');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117663;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 10);
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117680;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17 + 10]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 10);
    pfStack_1c50 = (fdb_kvs_handle *)0x11769a;
    fdb_compact(pfStack_1c30,"dummy2");
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1176ae;
      fdb_set(pfStack_1c28,apfStack_1c08[lVar17 + 0x14]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 5);
    lVar17 = 0;
    pfStack_1c50 = (fdb_kvs_handle *)0x1176c5;
    fdb_end_transaction(pfStack_1c38,'\0');
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x1176d7;
      fdb_set(pfStack_1c20,apfStack_1c08[lVar17 + 0x19]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 5);
    pfStack_1c50 = (fdb_kvs_handle *)0x1176ea;
    fdb_close(pfStack_1c30);
    pfStack_1c50 = (fdb_kvs_handle *)0x1176f4;
    fdb_close(pfStack_1c38);
    lVar17 = 0;
    do {
      pfStack_1c50 = (fdb_kvs_handle *)0x117700;
      fdb_doc_free(apfStack_1c08[lVar17]);
      lVar17 = lVar17 + 1;
    } while (lVar17 != 0x1e);
    pfStack_1c50 = (fdb_kvs_handle *)0x11770e;
    fdb_shutdown();
    pfStack_1c50 = (fdb_kvs_handle *)0x117713;
    memleak_end();
    pcVar16 = "%s PASSED\n";
    if (flush_before_commit_test()::__test_pass != '\0') {
      pcVar16 = "%s FAILED\n";
    }
    pfStack_1c50 = (fdb_kvs_handle *)0x117744;
    fprintf(_stderr,pcVar16,"flush before commit test");
    return;
  }
  pfStack_1c50 = (fdb_kvs_handle *)flush_before_commit_multi_writers_test;
  flush_before_commit_test();
  pcStack_1c58 = "dummy1";
  pfStack_2128 = (fdb_encryption_key *)0x11777e;
  pfStack_1c78 = &fStack_1b10;
  ppfStack_1c70 = &pfStack_1c30;
  ppfStack_1c68 = &pfStack_1c38;
  ppfStack_1c60 = &pfStack_1c28;
  pfStack_1c50 = unaff_RBP;
  gettimeofday(&tStack_2080,(__timezone_ptr_t)0x0);
  pfStack_2128 = (fdb_encryption_key *)0x117783;
  memleak_start();
  pfStack_2118 = (fdb_doc *)0x0;
  pfStack_2128 = (fdb_encryption_key *)0x117794;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_2128 = (fdb_encryption_key *)0x1177a4;
  fdb_get_default_config();
  fStack_1d70.buffercache_size = 0;
  fStack_1d70.wal_threshold = 8;
  fStack_1d70.flags = 1;
  fStack_1d70.purging_interval = 0;
  fStack_1d70.compaction_threshold = '\0';
  fStack_1d70.wal_flush_before_commit = true;
  pfStack_2128 = (fdb_encryption_key *)0x1177d6;
  fdb_get_default_kvs_config();
  pfStack_2128 = (fdb_encryption_key *)0x1177ed;
  fdb_open(&pfStack_2100,"dummy1",&fStack_1d70);
  pfStack_2128 = (fdb_encryption_key *)0x1177ff;
  fdb_kvs_open(pfStack_2100,&pfStack_2110,(char *)0x0,&fStack_2098);
  lVar17 = 0;
  uVar18 = 0;
  do {
    ppfVar10 = &fStack_2070.bub_ctx.handle;
    pfStack_2128 = (fdb_encryption_key *)0x11781f;
    sprintf((char *)ppfVar10,"key%d",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x117837;
    sprintf((char *)&fStack_2070.config.encryption_key,"meta%d",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x11784f;
    sprintf((char *)&fStack_2070,"body%d",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x11785f;
    sVar5 = strlen((char *)ppfVar10);
    pfVar15 = &fStack_2070.config.encryption_key;
    pfStack_2128 = (fdb_encryption_key *)0x117872;
    sVar6 = strlen((char *)pfVar15);
    pfStack_2128 = (fdb_encryption_key *)0x117882;
    sVar7 = strlen((char *)&fStack_2070);
    pfStack_2128 = (fdb_encryption_key *)0x1178a7;
    fdb_doc_create((fdb_doc **)((long)apfStack_20f0 + lVar17),&fStack_2070.bub_ctx.handle,sVar5,
                   pfVar15,sVar6,&fStack_2070,sVar7);
    pfStack_2128 = (fdb_encryption_key *)0x1178b6;
    fdb_set(pfStack_2110,apfStack_20f0[uVar18]);
    uVar18 = uVar18 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar18 != 10);
  pfStack_2128 = (fdb_encryption_key *)0x1178d6;
  fdb_commit(pfStack_2100,'\x01');
  pfStack_2128 = (fdb_encryption_key *)0x1178f2;
  fdb_open(&pfStack_20f8,"dummy1",&fStack_1d70);
  pfStack_2128 = (fdb_encryption_key *)0x117909;
  fdb_kvs_open(pfStack_20f8,&pfStack_2108,(char *)0x0,&fStack_2098);
  pfVar15 = &fStack_2070.config.encryption_key;
  lVar17 = 0;
  uVar18 = 0;
  do {
    pfStack_2128 = (fdb_encryption_key *)0x117932;
    sprintf((char *)pfVar15,"meta2%d",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x117946;
    sprintf((char *)&fStack_2070,"body2%d(db2)",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x117956;
    sVar5 = strlen((char *)pfVar15);
    pfStack_2128 = (fdb_encryption_key *)0x117961;
    sVar6 = strlen((char *)&fStack_2070);
    pfStack_2128 = (fdb_encryption_key *)0x117975;
    fdb_doc_update((fdb_doc **)((long)apfStack_20f0 + lVar17),pfVar15,sVar5,&fStack_2070,sVar6);
    pfStack_2128 = (fdb_encryption_key *)0x117984;
    fdb_set(pfStack_2108,apfStack_20f0[uVar18]);
    uVar18 = uVar18 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar18 != 5);
  uVar18 = 5;
  lVar17 = 0x28;
  pfVar15 = &fStack_2070.config.encryption_key;
  pfVar9 = &fStack_2070;
  do {
    pfStack_2128 = (fdb_encryption_key *)0x1179c6;
    sprintf((char *)pfVar15,"meta2%d",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x1179d5;
    sprintf((char *)pfVar9,"body2%d(db1)",uVar18 & 0xffffffff);
    pfStack_2128 = (fdb_encryption_key *)0x1179e5;
    sVar5 = strlen((char *)pfVar15);
    pfStack_2128 = (fdb_encryption_key *)0x1179f0;
    sVar6 = strlen((char *)pfVar9);
    pfStack_2128 = (fdb_encryption_key *)0x117a0b;
    fdb_doc_update((fdb_doc **)((long)apfStack_20f0 + lVar17),pfVar15,sVar5,pfVar9,sVar6);
    pfStack_2128 = (fdb_encryption_key *)0x117a1a;
    fdb_set(pfStack_2110,apfStack_20f0[uVar18]);
    uVar18 = uVar18 + 1;
    lVar17 = lVar17 + 8;
  } while (uVar18 != 10);
  ppfVar10 = &fStack_2070.bub_ctx.handle;
  pfVar15 = &fStack_2070.config.encryption_key;
  uVar18 = 0;
  do {
    pcVar16 = "body2%d(db1)";
    pfStack_2128 = (fdb_encryption_key *)0x117a54;
    sprintf((char *)ppfVar10,"key%d",uVar18);
    pfStack_2128 = (fdb_encryption_key *)0x117a67;
    sprintf((char *)pfVar15,"meta2%d",uVar18);
    if ((uint)uVar18 < 5) {
      pcVar16 = "body2%d(db2)";
    }
    pfStack_2128 = (fdb_encryption_key *)0x117a84;
    sprintf((char *)&fStack_2070,pcVar16,uVar18);
    pfStack_2128 = (fdb_encryption_key *)0x117a8c;
    sVar5 = strlen((char *)ppfVar10);
    pfStack_2128 = (fdb_encryption_key *)0x117aac;
    fdb_doc_create(&pfStack_2118,ppfVar10,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_2128 = (fdb_encryption_key *)0x117abb;
    fVar3 = fdb_get(pfStack_2110,pfStack_2118);
    pfVar8 = pfStack_2118;
    if (fVar3 != FDB_RESULT_SUCCESS) {
LAB_00117dc9:
      pfStack_2128 = (fdb_encryption_key *)0x117dce;
      flush_before_commit_multi_writers_test();
LAB_00117dce:
      pfStack_2128 = (fdb_encryption_key *)0x117dd3;
      flush_before_commit_multi_writers_test();
      pfVar8 = (fdb_doc *)pcVar16;
LAB_00117dd3:
      pfStack_2128 = (fdb_encryption_key *)0x117de3;
      flush_before_commit_multi_writers_test();
LAB_00117de3:
      pfStack_2128 = (fdb_encryption_key *)0x117df3;
      flush_before_commit_multi_writers_test();
LAB_00117df3:
      pfStack_2128 = (fdb_encryption_key *)0x117e03;
      flush_before_commit_multi_writers_test();
      goto LAB_00117e03;
    }
    pfVar9 = (fdb_kvs_handle *)pfStack_2118->meta;
    pfStack_2128 = (fdb_encryption_key *)0x117adb;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_2118->metalen);
    if (iVar4 != 0) {
      pfStack_2128 = (fdb_encryption_key *)0x117dc9;
      flush_before_commit_multi_writers_test();
      pcVar16 = (char *)pfVar8;
      goto LAB_00117dc9;
    }
    pfVar9 = (fdb_kvs_handle *)pfVar8->body;
    pfStack_2128 = (fdb_encryption_key *)0x117af6;
    iVar4 = bcmp(&fStack_2070,pfVar9,pfVar8->bodylen);
    if (iVar4 != 0) goto LAB_00117dd3;
    pfStack_2128 = (fdb_encryption_key *)0x117b06;
    fdb_doc_free(pfVar8);
    pcVar16 = (char *)0x0;
    pfStack_2118 = (fdb_doc *)0x0;
    pfStack_2128 = (fdb_encryption_key *)0x117b16;
    sVar5 = strlen((char *)ppfVar10);
    pfStack_2128 = (fdb_encryption_key *)0x117b32;
    fdb_doc_create(&pfStack_2118,ppfVar10,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_2128 = (fdb_encryption_key *)0x117b41;
    fVar3 = fdb_get(pfStack_2108,pfStack_2118);
    pfVar8 = pfStack_2118;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117dce;
    pfVar9 = (fdb_kvs_handle *)pfStack_2118->meta;
    pfStack_2128 = (fdb_encryption_key *)0x117b61;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_2118->metalen);
    if (iVar4 != 0) goto LAB_00117df3;
    pfVar9 = (fdb_kvs_handle *)pfVar8->body;
    pfStack_2128 = (fdb_encryption_key *)0x117b7c;
    iVar4 = bcmp(&fStack_2070,pfVar9,pfVar8->bodylen);
    if (iVar4 != 0) goto LAB_00117de3;
    pfStack_2128 = (fdb_encryption_key *)0x117b8c;
    fdb_doc_free(pfVar8);
    pfStack_2118 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar18 + 1;
    uVar18 = (ulong)uVar14;
  } while (uVar14 != 10);
  pfStack_2128 = (fdb_encryption_key *)0x117bb3;
  fdb_commit(pfStack_2100,'\0');
  pfStack_2128 = (fdb_encryption_key *)0x117bbf;
  fdb_commit(pfStack_20f8,'\0');
  ppfVar10 = &fStack_2070.bub_ctx.handle;
  pfVar15 = &fStack_2070.config.encryption_key;
  uVar18 = 0;
  while( true ) {
    pfStack_2128 = (fdb_encryption_key *)0x117bf3;
    sprintf((char *)ppfVar10,"key%d",uVar18);
    pfStack_2128 = (fdb_encryption_key *)0x117c06;
    sprintf((char *)pfVar15,"meta2%d",uVar18);
    pcVar16 = "body2%d(db1)";
    if ((uint)uVar18 < 5) {
      pcVar16 = "body2%d(db2)";
    }
    pfStack_2128 = (fdb_encryption_key *)0x117c20;
    sprintf((char *)&fStack_2070,pcVar16,uVar18);
    pfStack_2128 = (fdb_encryption_key *)0x117c28;
    sVar5 = strlen((char *)ppfVar10);
    pfStack_2128 = (fdb_encryption_key *)0x117c48;
    fdb_doc_create(&pfStack_2118,ppfVar10,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_2128 = (fdb_encryption_key *)0x117c57;
    fVar3 = fdb_get(pfStack_2110,pfStack_2118);
    pfVar8 = pfStack_2118;
    pfVar13 = (fdb_doc *)"body2%d(db2)";
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pfVar9 = (fdb_kvs_handle *)pfStack_2118->meta;
    pfStack_2128 = (fdb_encryption_key *)0x117c77;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_2118->metalen);
    if (iVar4 != 0) goto LAB_00117e03;
    pfVar9 = (fdb_kvs_handle *)pfVar8->body;
    pfStack_2128 = (fdb_encryption_key *)0x117c92;
    iVar4 = bcmp(&fStack_2070,pfVar9,pfVar8->bodylen);
    if (iVar4 != 0) goto LAB_00117e1d;
    pfStack_2128 = (fdb_encryption_key *)0x117ca2;
    fdb_doc_free(pfVar8);
    pfVar13 = (fdb_doc *)0x0;
    pfStack_2118 = (fdb_doc *)0x0;
    pfStack_2128 = (fdb_encryption_key *)0x117cb2;
    sVar5 = strlen((char *)ppfVar10);
    pfStack_2128 = (fdb_encryption_key *)0x117cce;
    fdb_doc_create(&pfStack_2118,ppfVar10,sVar5,(void *)0x0,0,(void *)0x0,0);
    pfStack_2128 = (fdb_encryption_key *)0x117cdd;
    fVar3 = fdb_get(pfStack_2108,pfStack_2118);
    pfVar8 = pfStack_2118;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00117e18;
    pfVar9 = (fdb_kvs_handle *)pfStack_2118->meta;
    pfStack_2128 = (fdb_encryption_key *)0x117cfd;
    iVar4 = bcmp(pfVar15,pfVar9,pfStack_2118->metalen);
    if (iVar4 != 0) goto LAB_00117e3d;
    pfVar9 = (fdb_kvs_handle *)pfVar8->body;
    pfStack_2128 = (fdb_encryption_key *)0x117d18;
    iVar4 = bcmp(&fStack_2070,pfVar9,pfVar8->bodylen);
    if (iVar4 != 0) goto LAB_00117e2d;
    pfStack_2128 = (fdb_encryption_key *)0x117d28;
    fdb_doc_free(pfVar8);
    pfStack_2118 = (fdb_doc *)0x0;
    uVar14 = (uint)uVar18 + 1;
    uVar18 = (ulong)uVar14;
    if (uVar14 == 10) {
      pfStack_2128 = (fdb_encryption_key *)0x117d4d;
      fdb_close(pfStack_2100);
      pfStack_2128 = (fdb_encryption_key *)0x117d57;
      fdb_close(pfStack_20f8);
      lVar17 = 0;
      do {
        pfStack_2128 = (fdb_encryption_key *)0x117d63;
        fdb_doc_free(apfStack_20f0[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      pfStack_2128 = (fdb_encryption_key *)0x117d71;
      fdb_shutdown();
      pfStack_2128 = (fdb_encryption_key *)0x117d76;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (flush_before_commit_multi_writers_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_2128 = (fdb_encryption_key *)0x117da7;
      fprintf(_stderr,pcVar16,"flush before commit with multi writers test");
      return;
    }
  }
LAB_00117e13:
  pfStack_2128 = (fdb_encryption_key *)0x117e18;
  flush_before_commit_multi_writers_test();
LAB_00117e18:
  pfStack_2128 = (fdb_encryption_key *)0x117e1d;
  flush_before_commit_multi_writers_test();
  pfVar8 = pfVar13;
LAB_00117e1d:
  pfStack_2128 = (fdb_encryption_key *)0x117e2d;
  flush_before_commit_multi_writers_test();
LAB_00117e2d:
  pfStack_2128 = (fdb_encryption_key *)0x117e3d;
  flush_before_commit_multi_writers_test();
LAB_00117e3d:
  pfVar19 = &fStack_2070;
  ppfVar10 = &fStack_2070.bub_ctx.handle;
  pfVar15 = &fStack_2070.config.encryption_key;
  pfStack_2128 = (fdb_encryption_key *)auto_commit_test;
  flush_before_commit_multi_writers_test();
  pfStack_24a0 = (fdb_encryption_key *)0x117e6a;
  uStack_2150 = uVar18;
  ppfStack_2148 = ppfVar10;
  pfStack_2140 = pfVar9;
  pfStack_2138 = pfVar8;
  pfStack_2130 = pfVar19;
  pfStack_2128 = pfVar15;
  gettimeofday((timeval *)(auStack_2478 + 0x20),(__timezone_ptr_t)0x0);
  pfStack_24a0 = (fdb_encryption_key *)0x117e6f;
  memleak_start();
  pfStack_24a0 = (fdb_encryption_key *)0x117e7b;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_2248;
  pfStack_24a0 = (fdb_encryption_key *)0x117e8b;
  fdb_get_default_config();
  pfStack_24a0 = (fdb_encryption_key *)0x117e95;
  fdb_get_default_kvs_config();
  fStack_2248.buffercache_size = 0;
  fStack_2248.wal_threshold = 0x1000;
  fStack_2248.flags = 1;
  fStack_2248.durability_opt = '\x02';
  fStack_2248.auto_commit = true;
  pfStack_24a0 = (fdb_encryption_key *)0x117ec8;
  fVar3 = fdb_open(&pfStack_2488,"dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pfStack_24a0 = (fdb_encryption_key *)0x117ee4;
    fVar3 = fdb_kvs_open_default(pfStack_2488,&pfStack_2490,(fdb_kvs_config *)(auStack_2478 + 8));
    pcVar16 = (char *)pfVar19;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118182;
    pcVar16 = "body%d";
    pfVar15 = (fdb_encryption_key *)0x0;
    do {
      pfStack_24a0 = (fdb_encryption_key *)0x117f15;
      sprintf((char *)afStack_2348,"key%d",pfVar15);
      pfStack_24a0 = (fdb_encryption_key *)0x117f24;
      sprintf((char *)apfStack_2448,"body%d",pfVar15);
      pfVar9 = pfStack_2490;
      pfStack_24a0 = (fdb_encryption_key *)0x117f31;
      sVar5 = strlen((char *)afStack_2348);
      pfVar11 = (fdb_config *)(sVar5 + 1);
      pfStack_24a0 = (fdb_encryption_key *)0x117f3d;
      sVar5 = strlen((char *)apfStack_2448);
      pfStack_24a0 = (fdb_encryption_key *)0x117f52;
      fVar3 = fdb_set_kv(pfVar9,afStack_2348,(size_t)pfVar11,apfStack_2448,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_24a0 = (fdb_encryption_key *)0x118159;
        auto_commit_test();
        goto LAB_00118159;
      }
      uVar14 = (int)pfVar15 + 1;
      pfVar15 = (fdb_encryption_key *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfVar8 = afStack_2348;
    ppfVar10 = apfStack_2448;
    pfVar9 = (fdb_kvs_handle *)auStack_2478;
    pfVar15 = (fdb_encryption_key *)auStack_2480;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_24a0 = (fdb_encryption_key *)0x117f90;
      sprintf((char *)pfVar8,"key%d",pfVar11);
      pfStack_24a0 = (fdb_encryption_key *)0x117fa3;
      sprintf((char *)ppfVar10,"body%d",pfVar11);
      pfVar19 = pfStack_2490;
      pfStack_24a0 = (fdb_encryption_key *)0x117fb0;
      sVar5 = strlen((char *)pfVar8);
      pfStack_24a0 = (fdb_encryption_key *)0x117fc5;
      fVar3 = fdb_get_kv(pfVar19,pfVar8,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar16 = (char *)auStack_2478._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118166;
      pfStack_24a0 = (fdb_encryption_key *)0x117fe2;
      iVar4 = bcmp((void *)auStack_2478._0_8_,ppfVar10,(size_t)auStack_2480);
      if (iVar4 != 0) goto LAB_00118159;
      pfStack_24a0 = (fdb_encryption_key *)0x117ff2;
      fdb_free_block(pcVar16);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_24a0 = (fdb_encryption_key *)0x118006;
    fVar3 = fdb_kvs_close(pfStack_2490);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118187;
    pfStack_24a0 = (fdb_encryption_key *)0x118018;
    fVar3 = fdb_close(pfStack_2488);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011818c;
    pfStack_24a0 = (fdb_encryption_key *)0x118039;
    fVar3 = fdb_open(&pfStack_2488,"dummy1",&fStack_2248);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118191;
    pfStack_24a0 = (fdb_encryption_key *)0x118055;
    fVar3 = fdb_kvs_open_default(pfStack_2488,&pfStack_2490,(fdb_kvs_config *)(auStack_2478 + 8));
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118196;
    pfVar8 = afStack_2348;
    ppfVar10 = apfStack_2448;
    pfVar9 = (fdb_kvs_handle *)auStack_2478;
    pfVar15 = (fdb_encryption_key *)auStack_2480;
    pfVar11 = (fdb_config *)0x0;
    do {
      pfStack_24a0 = (fdb_encryption_key *)0x118089;
      sprintf((char *)pfVar8,"key%d",pfVar11);
      pfStack_24a0 = (fdb_encryption_key *)0x11809c;
      sprintf((char *)ppfVar10,"body%d",pfVar11);
      pfVar19 = pfStack_2490;
      pfStack_24a0 = (fdb_encryption_key *)0x1180a9;
      sVar5 = strlen((char *)pfVar8);
      pfStack_24a0 = (fdb_encryption_key *)0x1180be;
      fVar3 = fdb_get_kv(pfVar19,pfVar8,sVar5 + 1,(void **)pfVar9,(size_t *)pfVar15);
      pcVar16 = (char *)auStack_2478._0_8_;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118178;
      pfStack_24a0 = (fdb_encryption_key *)0x1180db;
      iVar4 = bcmp((void *)auStack_2478._0_8_,ppfVar10,(size_t)auStack_2480);
      if (iVar4 != 0) goto LAB_0011816b;
      pfStack_24a0 = (fdb_encryption_key *)0x1180eb;
      fdb_free_block(pcVar16);
      uVar14 = (int)pfVar11 + 1;
      pfVar11 = (fdb_config *)(ulong)uVar14;
    } while (uVar14 != 5000);
    pfStack_24a0 = (fdb_encryption_key *)0x1180ff;
    fVar3 = fdb_close(pfStack_2488);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      pfStack_24a0 = (fdb_encryption_key *)0x11810c;
      fdb_shutdown();
      pfStack_24a0 = (fdb_encryption_key *)0x118111;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (auto_commit_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_24a0 = (fdb_encryption_key *)0x118142;
      fprintf(_stderr,pcVar16,"auto commit test");
      return;
    }
  }
  else {
LAB_0011817d:
    pfStack_24a0 = (fdb_encryption_key *)0x118182;
    auto_commit_test();
    pcVar16 = (char *)pfVar19;
LAB_00118182:
    pfStack_24a0 = (fdb_encryption_key *)0x118187;
    auto_commit_test();
LAB_00118187:
    pfStack_24a0 = (fdb_encryption_key *)0x11818c;
    auto_commit_test();
LAB_0011818c:
    pfStack_24a0 = (fdb_encryption_key *)0x118191;
    auto_commit_test();
LAB_00118191:
    pfStack_24a0 = (fdb_encryption_key *)0x118196;
    auto_commit_test();
LAB_00118196:
    pfStack_24a0 = (fdb_encryption_key *)0x11819b;
    auto_commit_test();
  }
  pfStack_24a0 = (fdb_encryption_key *)auto_commit_space_used_test;
  auto_commit_test();
  pcStack_2718 = (code *)0x1181bd;
  pfStack_24c8 = pfVar11;
  ppfStack_24c0 = ppfVar10;
  pfStack_24b8 = pfVar9;
  pfStack_24b0 = pfVar8;
  pfStack_24a8 = (fdb_kvs_handle *)pcVar16;
  pfStack_24a0 = pfVar15;
  gettimeofday(&tStack_26c8,(__timezone_ptr_t)0x0);
  pcStack_2718 = (code *)0x1181c2;
  memleak_start();
  pcStack_2718 = (code *)0x1181ce;
  system("rm -rf  func_test* > errorlog.txt");
  pcStack_2718 = (code *)0x1181de;
  fdb_get_default_config();
  fStack_25c0.buffercache_size = 0;
  fStack_25c0.auto_commit = true;
  pcStack_2718 = (code *)0x1181f7;
  fdb_get_default_config();
  pcStack_2718 = (code *)0x118207;
  memcpy(&fStack_25c0,afStack_26b8,0xf8);
  pcStack_2718 = (code *)0x118211;
  fdb_get_default_kvs_config();
  uVar18 = 0xfffffffc;
  while( true ) {
    builtin_strncpy(acStack_2700 + 8,"est1",5);
    builtin_strncpy(acStack_2700,"./func_t",8);
    pcStack_2718 = (code *)0x11825c;
    fVar3 = fdb_open(&pfStack_2710,acStack_2700,&fStack_25c0);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    pcStack_2718 = (code *)0x118278;
    fVar3 = fdb_kvs_open(pfStack_2710,&pfStack_2708,"justonekv",&fStack_26e0);
    if (fVar3 != FDB_RESULT_SUCCESS) {
      pcStack_2718 = (code *)0x118331;
      auto_commit_space_used_test();
      break;
    }
    pcStack_2718 = (code *)0x11828e;
    fVar3 = fdb_get_file_info(pfStack_2710,afStack_26b8);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011833b;
    if (afStack_26b8[0].file_size != fStack_25c0.blocksize * 7) {
      pcStack_2718 = (code *)0x1182dd;
      auto_commit_space_used_test();
    }
    pcStack_2718 = (code *)0x1182b9;
    fVar3 = fdb_close(pfStack_2710);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118336;
    uVar14 = (int)uVar18 + 1;
    uVar18 = (ulong)uVar14;
    if (uVar14 == 0) {
      pcStack_2718 = (code *)0x1182e4;
      fdb_shutdown();
      pcStack_2718 = (code *)0x1182e9;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (auto_commit_space_used_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_2718 = (code *)0x11831a;
      fprintf(_stderr,pcVar16,"auto_commit space used on close test");
      return;
    }
  }
  pcStack_2718 = (code *)0x118336;
  auto_commit_space_used_test();
LAB_00118336:
  pcStack_2718 = (code *)0x11833b;
  auto_commit_space_used_test();
LAB_0011833b:
  pcStack_2718 = last_wal_flush_header_test;
  auto_commit_space_used_test();
  uStack_2720 = 0x745f636e75662f2e;
  pcStack_2730 = "justonekv";
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118363;
  ppfStack_2740 = &pfStack_2708;
  pcStack_2738 = acStack_2700;
  uStack_2728 = uVar18;
  pcStack_2718 = (code *)&pfStack_2710;
  gettimeofday(&tStack_2b50,(__timezone_ptr_t)0x0);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118368;
  memleak_start();
  pfStack_2c98 = (fdb_doc *)0x0;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118379;
  system("rm -rf  dummy* > errorlog.txt");
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118389;
  fdb_get_default_config();
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118396;
  fdb_get_default_kvs_config();
  fStack_2b40.buffercache_size = 0;
  fStack_2b40.flags = 1;
  fStack_2b40.purging_interval = 0;
  fStack_2b40.compaction_threshold = '\0';
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1183c9;
  fdb_open((fdb_file_handle **)(auStack_2c88 + 0x10),"dummy1",&fStack_2b40);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1183dc;
  fdb_open((fdb_file_handle **)auStack_2c88,"dummy1",&fStack_2b40);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1183ed;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._16_8_,&pfStack_2c90,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1183fe;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c88._0_8_,(fdb_kvs_handle **)(auStack_2c88 + 8),
             &fStack_2c60);
  ppfVar12 = apfStack_2c48;
  uVar18 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118422;
    sprintf(acStack_2a48,"key%d",uVar18 & 0xffffffff);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11843e;
    sprintf(acStack_2848,"meta%d",uVar18 & 0xffffffff);
    ptr_fhandle_00 = apfStack_2948;
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11845a;
    sprintf((char *)ptr_fhandle_00,"body%d",uVar18 & 0xffffffff);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118462;
    ppfVar10 = (fdb_kvs_handle **)strlen(acStack_2a48);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11846d;
    sVar5 = strlen(acStack_2848);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118478;
    sVar6 = strlen((char *)ptr_fhandle_00);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118498;
    fdb_doc_create(ppfVar12,acStack_2a48,(size_t)ppfVar10,acStack_2848,sVar5,ptr_fhandle_00,sVar6);
    uVar18 = uVar18 + 1;
    ppfVar12 = ppfVar12 + 1;
  } while (uVar18 != 0x1e);
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1184ba;
    fdb_set(pfStack_2c90,apfStack_2c48[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1184d2;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1184e3;
    fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1184fe;
  fdb_commit((fdb_file_handle *)auStack_2c88._16_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118506;
  fdb_close((fdb_file_handle *)auStack_2c88._16_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118513;
  fdb_close((fdb_file_handle *)auStack_2c88._0_8_);
  ppfVar21 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_2b40;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118530;
  fdb_open((fdb_file_handle **)(auStack_2c88 + 0x10),"dummy1",pfVar11);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11853e;
  fdb_open((fdb_file_handle **)auStack_2c88,"dummy1",pfVar11);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118553;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._16_8_,&pfStack_2c90,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118563;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c88._0_8_,(fdb_kvs_handle **)(auStack_2c88 + 8),
             &fStack_2c60);
  uVar18 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11858f;
    fdb_doc_create(&pfStack_2c98,apfStack_2c48[uVar18]->key,apfStack_2c48[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11859e;
    fVar3 = fdb_get(pfStack_2c90,pfStack_2c98);
    if (uVar18 < 2) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b46;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b4b;
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1185bf;
    fdb_doc_free(pfStack_2c98);
    pfStack_2c98 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 4);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1185e0;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1185f1;
    fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[lVar17 + 2]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11860e;
    fdb_set(pfStack_2c90,apfStack_2c48[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118629;
  fdb_end_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118636;
  fdb_close((fdb_file_handle *)auStack_2c88._16_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11863e;
  fdb_close((fdb_file_handle *)auStack_2c88._0_8_);
  ppfVar21 = (fdb_kvs_handle **)0x1551a5;
  pfVar11 = &fStack_2b40;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11865b;
  fdb_open((fdb_file_handle **)(auStack_2c88 + 0x10),"dummy1",pfVar11);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118669;
  fdb_open((fdb_file_handle **)auStack_2c88,"dummy1",pfVar11);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11867e;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._16_8_,&pfStack_2c90,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11868e;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2c88._0_8_,(fdb_kvs_handle **)(auStack_2c88 + 8),
             &fStack_2c60);
  uVar18 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1186ba;
    fdb_doc_create(&pfStack_2c98,apfStack_2c48[uVar18]->key,apfStack_2c48[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1186c9;
    fVar3 = fdb_get(pfStack_2c90,pfStack_2c98);
    if ((uVar18 < 4) && (fVar3 != FDB_RESULT_SUCCESS)) {
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118b41;
      last_wal_flush_header_test();
      goto LAB_00118b41;
    }
    ppfStack_2cb0 = (fdb_kvs_handle **)0x1186e1;
    fdb_doc_free(pfStack_2c98);
    pfStack_2c98 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 6);
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118707;
    fdb_set(pfStack_2c90,apfStack_2c48[lVar17 + 4]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11871f;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x02');
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118733;
    fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[lVar17 + 6]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11874b;
  fdb_commit((fdb_file_handle *)auStack_2c88._16_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118767;
  fdb_open(&pfStack_2c70,"dummy1",&fStack_2b40);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118779;
  fdb_kvs_open_default(pfStack_2c70,&pfStack_2c68,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118786;
  fdb_begin_transaction(pfStack_2c70,'\x02');
  lVar17 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11879a;
    fdb_set(pfStack_2c68,apfStack_2c48[lVar17 + 8]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 2);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187b2;
  fdb_end_transaction(pfStack_2c70,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187bf;
  fdb_close((fdb_file_handle *)auStack_2c88._16_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187c9;
  fdb_close((fdb_file_handle *)auStack_2c88._0_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187d3;
  fdb_close(pfStack_2c70);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187ea;
  fdb_open((fdb_file_handle **)(auStack_2c88 + 0x10),"dummy1",&fStack_2b40);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1187fc;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._16_8_,&pfStack_2c90,&fStack_2c60);
  uVar18 = 0;
  do {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118828;
    fdb_doc_create(&pfStack_2c98,apfStack_2c48[uVar18]->key,apfStack_2c48[uVar18]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118837;
    fVar3 = fdb_get(pfStack_2c90,pfStack_2c98);
    if ((int)uVar18 - 8U < 0xfffffffe) {
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00118b50;
    }
    else if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_00118b55;
    ppfStack_2cb0 = (fdb_kvs_handle **)0x11885b;
    fdb_doc_free(pfStack_2c98);
    pfStack_2c98 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
  } while (uVar18 != 10);
  pfVar11 = (fdb_config *)auStack_2c88;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11888f;
  fdb_open((fdb_file_handle **)pfVar11,"dummy1",&fStack_2b40);
  ptr_fhandle_00 = &pfStack_2c70;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1188a2;
  fdb_open(ptr_fhandle_00,"dummy1",&fStack_2b40);
  ppfVar21 = (fdb_kvs_handle **)(auStack_2c88 + 8);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1188bb;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._0_8_,ppfVar21,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1188cf;
  fdb_kvs_open_default(pfStack_2c70,&pfStack_2c68,&fStack_2c60);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1188dd;
  fdb_begin_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x02');
  ppfVar10 = &pfStack_2c90;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1188f3;
  fdb_set(pfStack_2c90,apfStack_2c48[10]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118905;
  fdb_commit((fdb_file_handle *)auStack_2c88._16_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118916;
  fdb_set(pfStack_2c90,apfStack_2c48[0xb]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118926;
  fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[0xc]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118933;
  fdb_commit((fdb_file_handle *)auStack_2c88._16_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118943;
  fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[0xd]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118951;
  fdb_begin_transaction(pfStack_2c70,'\x02');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118961;
  fdb_set(pfStack_2c68,apfStack_2c48[0xe]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11896f;
  fdb_end_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11897f;
  fdb_set(pfStack_2c68,apfStack_2c48[0xf]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118990;
  fdb_set(pfStack_2c90,apfStack_2c48[0x10]);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x11899e;
  fdb_end_transaction(pfStack_2c70,'\x01');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189af;
  fdb_set(pfStack_2c90,apfStack_2c48[0x11]);
  uVar18 = 0;
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189bc;
  fdb_commit((fdb_file_handle *)auStack_2c88._16_8_,'\0');
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189c4;
  fdb_close((fdb_file_handle *)auStack_2c88._16_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189cd;
  fdb_close((fdb_file_handle *)auStack_2c88._0_8_);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189d6;
  fdb_close(pfStack_2c70);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189ed;
  fdb_open((fdb_file_handle **)(auStack_2c88 + 0x10),"dummy1",&fStack_2b40);
  ppfStack_2cb0 = (fdb_kvs_handle **)0x1189fd;
  fdb_kvs_open_default((fdb_file_handle *)auStack_2c88._16_8_,ppfVar10,&fStack_2c60);
  while( true ) {
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118a29;
    fdb_doc_create(&pfStack_2c98,apfStack_2c48[uVar18 + 10]->key,apfStack_2c48[uVar18 + 10]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118a38;
    fVar3 = fdb_get(pfStack_2c90,pfStack_2c98);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ppfStack_2cb0 = (fdb_kvs_handle **)0x118a4a;
    fdb_doc_free(pfStack_2c98);
    pfStack_2c98 = (fdb_doc *)0x0;
    uVar18 = uVar18 + 1;
    if (uVar18 == 8) {
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118a78;
      fdb_open((fdb_file_handle **)auStack_2c88,"dummy1",&fStack_2b40);
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118a8d;
      fdb_kvs_open_default
                ((fdb_file_handle *)auStack_2c88._0_8_,(fdb_kvs_handle **)(auStack_2c88 + 8),
                 &fStack_2c60);
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118a9a;
      fdb_begin_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x02');
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118aaa;
      fdb_set((fdb_kvs_handle *)auStack_2c88._8_8_,apfStack_2c48[0x14]);
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118abb;
      fdb_compact((fdb_file_handle *)auStack_2c88._16_8_,"dummy2");
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118ac8;
      fdb_end_transaction((fdb_file_handle *)auStack_2c88._0_8_,'\x01');
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118ad2;
      fdb_close((fdb_file_handle *)auStack_2c88._16_8_);
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118ada;
      fdb_close((fdb_file_handle *)auStack_2c88._0_8_);
      lVar17 = 0;
      do {
        ppfStack_2cb0 = (fdb_kvs_handle **)0x118ae6;
        fdb_doc_free(apfStack_2c48[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1e);
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118af4;
      fdb_shutdown();
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118af9;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (last_wal_flush_header_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      ppfStack_2cb0 = (fdb_kvs_handle **)0x118b2a;
      fprintf(_stderr,pcVar16,"last wal flush header test");
      return;
    }
  }
LAB_00118b41:
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118b46;
  last_wal_flush_header_test();
LAB_00118b46:
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118b4b;
  last_wal_flush_header_test();
LAB_00118b4b:
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118b50;
  last_wal_flush_header_test();
LAB_00118b50:
  ppfStack_2cb0 = (fdb_kvs_handle **)0x118b55;
  last_wal_flush_header_test();
LAB_00118b55:
  ppfStack_2cb0 = (fdb_kvs_handle **)long_key_test;
  last_wal_flush_header_test();
  pfStack_18ef8 = (fdb_doc *)0x118b77;
  ppfStack_2cd8 = &pfStack_2c98;
  pfStack_2cd0 = pfVar11;
  ppfStack_2cc8 = ptr_fhandle_00;
  uStack_2cc0 = uVar18;
  ppfStack_2cb8 = ppfVar21;
  ppfStack_2cb0 = ppfVar10;
  gettimeofday(&tStack_18e90,(__timezone_ptr_t)0x0);
  pfStack_18ef8 = (fdb_doc *)0x118b7c;
  memleak_start();
  pfStack_18ee0 = (fdb_doc *)0x0;
  pfStack_18ef8 = (fdb_doc *)0x118b91;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_18ef8 = (fdb_doc *)0x118ba1;
  fdb_get_default_config();
  pfStack_18ef8 = (fdb_doc *)0x118bae;
  fdb_get_default_kvs_config();
  fStack_18c18.flags = 1;
  fStack_18c18.purging_interval = 0;
  fStack_18c18.compaction_threshold = '\0';
  fStack_18c18.durability_opt = '\x02';
  pfStack_18ef8 = (fdb_doc *)0x118bdb;
  fdb_open(&pfStack_18ed8,"dummy1",&fStack_18c18);
  pfStack_18ef8 = (fdb_doc *)0x118beb;
  fdb_kvs_open_default(pfStack_18ed8,&pfStack_18ec8,&fStack_18e80);
  ppfVar12 = apfStack_18a20;
  pfVar8 = afStack_18e20;
  pfVar13 = (fdb_doc *)0x0;
  lVar17 = 0;
  do {
    sVar5 = 0xff7f;
    if (lVar17 == 1) {
      sVar5 = 0x1fff;
    }
    if (lVar17 == 0) {
      sVar5 = 0x7fff;
    }
    pfStack_18ef8 = (fdb_doc *)0x118c39;
    lStack_18ec0 = lVar17;
    memset(asStack_12c60,0x5f,sVar5);
    *(undefined1 *)((long)asStack_12c60 + sVar5) = 0;
    lVar17 = 0;
    doc_00 = ppfVar12;
    lStack_18eb8 = (long)pfVar13;
    ppfStack_18eb0 = ppfVar12;
    sStack_18e98 = sVar5;
    do {
      pfStack_18ef8 = (fdb_doc *)0x118c6f;
      lStack_18ea8 = lVar17;
      sprintf((char *)pfVar8,"%08d");
      asStack_12c60[0] = afStack_18e20[0].keylen;
      uVar18 = 0;
      lStack_18ed0 = (long)pfVar13;
      ppfStack_18ea0 = doc_00;
      do {
        pfStack_18ef8 = (fdb_doc *)0x118cab;
        sprintf((char *)pfVar8,"%08d",uVar18 & 0xffffffff);
        *(size_t *)((long)apfStack_18a20 + sStack_18e98 + 0x5db8) = afStack_18e20[0].keylen;
        uVar14 = (int)lStack_18ed0 + (int)uVar18;
        pfStack_18ef8 = (fdb_doc *)0x118ce4;
        sprintf(acStack_18b20,"meta%d",(ulong)uVar14);
        pfStack_18ef8 = (fdb_doc *)0x118cf7;
        sprintf(acStack_18d20,"body%d",(ulong)uVar14);
        pfStack_18ef8 = (fdb_doc *)0x118d04;
        sVar5 = strlen((char *)asStack_12c60);
        pfStack_18ef8 = (fdb_doc *)0x118d10;
        sVar6 = strlen(acStack_18b20);
        pfStack_18ef8 = (fdb_doc *)0x118d24;
        sVar7 = strlen(acStack_18d20);
        lVar1 = lStack_18ed0;
        pcVar16 = acStack_18d20;
        pfStack_18ef8 = (fdb_doc *)0x118d57;
        fdb_doc_create(doc_00,asStack_12c60,sVar5 + 1,acStack_18b20,sVar6 + 1,pcVar16,sVar7 + 1);
        uVar18 = uVar18 + 1;
        doc_00 = doc_00 + 1;
      } while (uVar18 != 10);
      lVar17 = lStack_18ea8 + 1;
      doc_00 = ppfStack_18ea0 + 10;
      pfVar13 = (fdb_doc *)(lVar1 + 10);
    } while (lVar17 != 100);
    lVar17 = lStack_18ec0 + 1;
    ppfVar12 = ppfStack_18eb0 + 1000;
    pfVar13 = (fdb_doc *)(lStack_18eb8 + 1000);
  } while (lVar17 != 3);
  lVar17 = 0;
  do {
    pfStack_18ef8 = (fdb_doc *)0x118dcd;
    fdb_set(pfStack_18ec8,apfStack_18a20[lVar17]);
    lVar17 = lVar17 + 1;
  } while (lVar17 != 3000);
  pfStack_18ef8 = (fdb_doc *)0x118de8;
  fdb_commit(pfStack_18ed8,'\x01');
  pfStack_18ef8 = (fdb_doc *)0x118dfd;
  fdb_get_file_info(pfStack_18ed8,&fStack_18e68);
  if (fStack_18e68.doc_count != 3000) {
    pfStack_18ef8 = (fdb_doc *)0x118e14;
    long_key_test();
  }
  lVar17 = 0;
  while( true ) {
    pfStack_18ef8 = (fdb_doc *)0x118e43;
    fdb_doc_create(&pfStack_18ee0,apfStack_18a20[lVar17]->key,apfStack_18a20[lVar17]->keylen,
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_18ef8 = (fdb_doc *)0x118e52;
    fVar3 = fdb_get(pfStack_18ec8,pfStack_18ee0);
    pfVar20 = pfStack_18ee0;
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    doc_00 = (fdb_doc **)pfStack_18ee0->key;
    pfVar8 = apfStack_18a20[lVar17];
    pcVar16 = (char *)pfVar8->key;
    pfStack_18ef8 = (fdb_doc *)0x118e7d;
    iVar4 = bcmp(doc_00,pcVar16,pfStack_18ee0->keylen);
    pfVar13 = pfVar20;
    if (iVar4 != 0) {
      pfStack_18ef8 = (fdb_doc *)0x118f61;
      long_key_test();
      break;
    }
    doc_00 = (fdb_doc **)pfVar20->meta;
    pcVar16 = (char *)pfVar8->meta;
    pfStack_18ef8 = (fdb_doc *)0x118e9c;
    iVar4 = bcmp(doc_00,pcVar16,pfVar20->metalen);
    if (iVar4 != 0) goto LAB_00118f71;
    doc_00 = (fdb_doc **)pfVar20->body;
    pcVar16 = (char *)pfVar8->body;
    pfStack_18ef8 = (fdb_doc *)0x118ebb;
    iVar4 = bcmp(doc_00,pcVar16,pfVar20->bodylen);
    if (iVar4 != 0) goto LAB_00118f66;
    pfStack_18ef8 = (fdb_doc *)0x118ecb;
    fdb_doc_free(pfVar20);
    pfStack_18ee0 = (fdb_doc *)0x0;
    lVar17 = lVar17 + 1;
    if (lVar17 == 3000) {
      pfStack_18ef8 = (fdb_doc *)0x118eee;
      fdb_close(pfStack_18ed8);
      lVar17 = 0;
      do {
        pfStack_18ef8 = (fdb_doc *)0x118efd;
        fdb_doc_free(apfStack_18a20[lVar17]);
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3000);
      pfStack_18ef8 = (fdb_doc *)0x118f0e;
      fdb_shutdown();
      pfStack_18ef8 = (fdb_doc *)0x118f13;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (long_key_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_18ef8 = (fdb_doc *)0x118f44;
      fprintf(_stderr,pcVar16,"long key test");
      return;
    }
  }
  pfStack_18ef8 = (fdb_doc *)0x118f66;
  long_key_test();
LAB_00118f66:
  pfStack_18ef8 = (fdb_doc *)0x118f71;
  long_key_test();
LAB_00118f71:
  pfStack_18ef8 = (fdb_doc *)open_multi_files_kvs_test;
  long_key_test();
  pfStack_1d3f0 = (fdb_kvs_handle *)0x118f9c;
  ppfStack_18f20 = &pfStack_18ee0;
  pcStack_18f18 = pcVar16;
  lStack_18f10 = lVar17;
  pfStack_18f08 = pfVar13;
  ppfStack_18f00 = doc_00;
  pfStack_18ef8 = pfVar8;
  gettimeofday((timeval *)(auStack_1d3a8 + 0x70),(__timezone_ptr_t)0x0);
  pfStack_1d3f0 = (fdb_kvs_handle *)0x118fa1;
  memleak_start();
  pfStack_1d3f0 = (fdb_kvs_handle *)0x118fad;
  system("rm -rf  dummy* > errorlog.txt");
  pfStack_1d3f0 = (fdb_kvs_handle *)0x118fbd;
  fdb_get_default_config();
  pfStack_1d3f0 = (fdb_kvs_handle *)0x118fc7;
  fdb_get_default_kvs_config();
  fStack_1d220.wal_threshold = 0x400;
  fStack_1d220.compaction_mode = '\0';
  fStack_1d220.durability_opt = '\x02';
  pcVar22 = (char *)&fStack_1cf28;
  ppfVar21 = apfStack_1d128;
  pcVar16 = "kvs%d";
  uVar18 = 0;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119007;
    sprintf((char *)ppfVar21,"dummy%d",(ulong)ppfVar10 & 0xffffffff);
    ptr_handle_00 = (char *)(apfStack_1d328 + (long)ppfVar10 + -10);
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119022;
    fVar3 = fdb_open((fdb_file_handle **)ptr_handle_00,(char *)ppfVar21,&fStack_1d220);
    pfVar9 = (fdb_kvs_handle *)pcVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119452;
    ppfVar2 = (fdb_kvs_handle **)0x0;
    ppfStack_1d3d0 = ppfVar10;
    pfStack_1d3c8 = (fdb_kvs_handle *)pcVar22;
    do {
      ppfVar10 = ppfVar2;
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119048;
      sprintf((char *)ppfVar21,"kvs%d",(ulong)(uint)((int)ppfVar10 + (int)uVar18));
      pfStack_1d3f0 = (fdb_kvs_handle *)0x11905b;
      fVar3 = fdb_kvs_open((fdb_file_handle *)*(fdb_kvs_handle **)ptr_handle_00,
                           (fdb_kvs_handle **)pcVar22,(char *)ppfVar21,&fStack_1d3c0);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        pfStack_1d3f0 = (fdb_kvs_handle *)0x11943e;
        open_multi_files_kvs_test();
        goto LAB_0011943e;
      }
      pcVar22 = (char *)&(((fdb_kvs_handle *)pcVar22)->kvs_config).custom_cmp;
      ppfVar2 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
    } while ((fdb_kvs_handle **)((long)ppfVar10 + 1) != (fdb_kvs_handle **)0x80);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfStack_1d3d0 + 1);
    uVar18 = uVar18 + 0x80;
    pcVar22 = (char *)&pfStack_1d3c8[1].bub_ctx.space_used;
  } while (ppfVar10 != (fdb_kvs_handle **)0x8);
  ppfVar10 = apfStack_1d328;
  ppfVar21 = apfStack_1d028;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar18 = 0;
    do {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1190bd;
      sprintf((char *)ppfVar10,"key%08d",uVar18);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1190d0;
      sprintf((char *)ppfVar21,"value%08d",uVar18);
      pcVar16 = *(char **)(&fStack_1cf28.kvs_config.create_if_missing + (long)pfVar9 * 8);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1190e0;
      sVar5 = strlen((char *)ppfVar10);
      ptr_handle_00 = (char *)(sVar5 + 1);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1190ec;
      sVar5 = strlen((char *)ppfVar21);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119101;
      fVar3 = fdb_set_kv((fdb_kvs_handle *)pcVar16,ppfVar10,(size_t)ptr_handle_00,ppfVar21,sVar5 + 1
                        );
      pcVar22 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011943e;
      uVar14 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar14;
    } while (uVar14 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  ptr_handle_00 = (char *)0x0;
  do {
    if (((ulong)ptr_handle_00 & 1) == 0) {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x11912f;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1d328[(long)ptr_handle_00 + -10],'\0');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119470;
    }
    else {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119142;
      fVar3 = fdb_commit((fdb_file_handle *)apfStack_1d328[(long)ptr_handle_00 + -10],'\x01');
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119475;
    }
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  ppfVar21 = (fdb_kvs_handle **)0xffffffffffffff80;
  ptr_handle_00 = (char *)apfStack_1af28;
  ppfVar10 = (fdb_kvs_handle **)(auStack_1d3a8 + 8);
  pfVar9 = (fdb_kvs_handle *)auStack_1d3a8;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x11917c;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_1cb28[(long)ppfVar21],(fdb_kvs_info *)pfVar9);
    if ((fdb_custom_cmp_variable)auStack_1d3a8._8_8_ != (fdb_custom_cmp_variable)0xa) {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1191bf;
      open_multi_files_kvs_test();
    }
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119199;
    fVar3 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1cb28[(long)ppfVar21],
                              (fdb_kvs_handle **)ptr_handle_00,auStack_1d3a8._8_8_);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119457;
    ppfVar21 = ppfVar21 + 0x10;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 0x400);
  } while (ppfVar21 < (fdb_kvs_handle **)0x380);
  ptr_handle_00 = (char *)0x0;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x1191cf;
    fVar3 = fdb_compact((fdb_file_handle *)apfStack_1d328[(long)ptr_handle_00 - 10],(char *)0x0);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_0011945c;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
  } while ((fdb_kvs_handle **)ptr_handle_00 != (fdb_kvs_handle **)0x8);
  ptr_handle_00 = (char *)&pfStack_1d3d8;
  pfStack_1d3d8 = (fdb_kvs_handle *)0x0;
  ppfVar10 = &pfStack_1d3e0;
  pcVar22 = "key%08d";
  ppfVar21 = apfStack_1d328;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119224;
    fdb_iterator_init(apfStack_1af28[(long)pfVar9],(fdb_iterator **)ppfVar10,(void *)0x0,0,
                      (void *)0x0,0,0);
    uVar18 = 0;
    do {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119233;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1d3e0,(fdb_doc **)ptr_handle_00);
      pcVar16 = (char *)pfVar9;
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119443;
      pfStack_1d3f0 = (fdb_kvs_handle *)0x11924a;
      sprintf((char *)ppfVar21,"key%08d",uVar18);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x11925b;
      iVar4 = strcmp((char *)ppfVar21,(char *)pfStack_1d3d8->op_stats);
      if (iVar4 != 0) {
        pfStack_1d3f0 = (fdb_kvs_handle *)0x11927d;
        open_multi_files_kvs_test();
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x11926b;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1d3e0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119289;
    fdb_iterator_close((fdb_iterator *)pfStack_1d3e0);
    pcVar16 = (char *)&(pfVar9->config).wal_threshold;
    bVar23 = pfVar9 < (fdb_kvs_handle *)0x380;
    pfVar9 = (fdb_kvs_handle *)pcVar16;
  } while (bVar23);
  pfStack_1d3f0 = (fdb_kvs_handle *)0x1192aa;
  fdb_doc_free((fdb_doc *)pfStack_1d3d8);
  ptr_handle_00 = "key%08d";
  ppfVar10 = apfStack_1d328;
  ppfVar21 = (fdb_kvs_handle **)0x0;
  do {
    uVar18 = 0;
    do {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1192cd;
      sprintf((char *)ppfVar10,"key%08d",uVar18);
      pcVar22 = *(char **)(&fStack_1cf28.kvs_config.create_if_missing + (long)ppfVar21 * 8);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1192dd;
      sVar5 = strlen((char *)ppfVar10);
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1192ec;
      fVar3 = fdb_del_kv((fdb_kvs_handle *)pcVar22,ppfVar10,sVar5 + 1);
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119448;
      uVar14 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar14;
    } while (uVar14 != 10);
    ppfVar21 = (fdb_kvs_handle **)((long)ppfVar21 + 1);
  } while (ppfVar21 != (fdb_kvs_handle **)0x400);
  ptr_handle_00 = "dummy_compact%d";
  ppfVar10 = apfStack_1d128;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119329;
    sprintf((char *)ppfVar10,"dummy_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfStack_1d3f0 = (fdb_kvs_handle *)0x119336;
    fVar3 = fdb_compact((fdb_file_handle *)
                        apfStack_1d328[(long)((long)&pfVar9[-1].bub_ctx.space_used + 6)],
                        (char *)ppfVar10);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119461;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  ptr_handle_00 = (char *)&pfStack_1d3d8;
  pfStack_1d3d8 = (fdb_kvs_handle *)0x0;
  ppfVar10 = &pfStack_1d3e0;
  pcVar22 = (char *)(fdb_kvs_handle *)0x0;
  do {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x11937c;
    fVar3 = fdb_iterator_init(*(fdb_kvs_handle **)
                               (&fStack_1cf28.kvs_config.create_if_missing + (long)pcVar22 * 8),
                              (fdb_iterator **)ppfVar10,(void *)0x0,0,(void *)0x0,0,2);
    pfVar9 = (fdb_kvs_handle *)pcVar22;
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119466;
    do {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119391;
      fVar3 = fdb_iterator_get((fdb_iterator *)pfStack_1d3e0,(fdb_doc **)ptr_handle_00);
      if (fVar3 == FDB_RESULT_SUCCESS) goto LAB_0011944d;
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1193a3;
      fVar3 = fdb_iterator_next((fdb_iterator *)pfStack_1d3e0);
    } while (fVar3 != FDB_RESULT_ITERATOR_FAIL);
    pfStack_1d3f0 = (fdb_kvs_handle *)0x1193b2;
    fdb_iterator_close((fdb_iterator *)pfStack_1d3e0);
    pfVar9 = (fdb_kvs_handle *)&(((fdb_kvs_handle *)pcVar22)->config).wal_threshold;
    bVar23 = pcVar22 < (fdb_kvs_handle *)0x380;
    pcVar22 = (char *)pfVar9;
  } while (bVar23);
  pfStack_1d3f0 = (fdb_kvs_handle *)0x1193cf;
  fdb_doc_free((fdb_doc *)pfStack_1d3d8);
  ptr_handle_00 = (char *)0x0;
  while( true ) {
    pfStack_1d3f0 = (fdb_kvs_handle *)0x1193db;
    fVar3 = fdb_close((fdb_file_handle *)apfStack_1d328[(long)ptr_handle_00 - 10]);
    if (fVar3 != FDB_RESULT_SUCCESS) break;
    ptr_handle_00 = (char *)((long)ptr_handle_00 + 1);
    if ((fdb_kvs_handle **)ptr_handle_00 == (fdb_kvs_handle **)0x8) {
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1193f1;
      fdb_shutdown();
      pfStack_1d3f0 = (fdb_kvs_handle *)0x1193f6;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (open_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_1d3f0 = (fdb_kvs_handle *)0x119427;
      fprintf(_stderr,pcVar16,"open multi files kvs test");
      return;
    }
  }
LAB_0011946b:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119470;
  open_multi_files_kvs_test();
LAB_00119470:
  pfStack_1d3f0 = (fdb_kvs_handle *)0x119475;
  open_multi_files_kvs_test();
LAB_00119475:
  pfStack_1d3f0 = (fdb_kvs_handle *)get_byoffset_diff_kvs_test;
  open_multi_files_kvs_test();
  pcStack_1d768 = (code *)0x119494;
  ppfStack_1d408 = (fdb_kvs_handle **)ptr_handle_00;
  ppfStack_1d400 = ppfVar21;
  ppfStack_1d3f8 = ppfVar10;
  pfStack_1d3f0 = pfVar9;
  gettimeofday(&tStack_1d718,(__timezone_ptr_t)0x0);
  pcStack_1d768 = (code *)0x119499;
  memleak_start();
  pcStack_1d768 = (code *)0x1194a5;
  system("rm -rf  dummy* > errorlog.txt");
  pfVar11 = &fStack_1d708;
  pcStack_1d768 = (code *)0x1194b2;
  fdb_get_default_config();
  pcStack_1d768 = (code *)0x1194bc;
  fdb_get_default_kvs_config();
  pcStack_1d768 = (code *)0x1194d0;
  fVar3 = fdb_open(&pfStack_1d748,"./dummy1",pfVar11);
  if (fVar3 == FDB_RESULT_SUCCESS) {
    pcStack_1d768 = (code *)0x1194f3;
    fVar3 = fdb_kvs_open(pfStack_1d748,&pfStack_1d740,"db",&fStack_1d730);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196a6;
    pcStack_1d768 = (code *)0x119516;
    fVar3 = fdb_kvs_open(pfStack_1d748,&pfStack_1d738,"db2",&fStack_1d730);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ab;
    pfVar11 = &fStack_1d510;
    pcStack_1d768 = (code *)0x119539;
    sprintf((char *)pfVar11,"key%d",0);
    ppfVar10 = apfStack_1d610;
    pcStack_1d768 = (code *)0x119554;
    sprintf((char *)ppfVar10,"body%d",0);
    pcStack_1d768 = (code *)0x11955c;
    pfVar9 = (fdb_kvs_handle *)strlen((char *)pfVar11);
    pcStack_1d768 = (code *)0x119567;
    sVar5 = strlen((char *)ppfVar10);
    ppfVar21 = &pfStack_1d750;
    pcStack_1d768 = (code *)0x119589;
    fdb_doc_create((fdb_doc **)ppfVar21,pfVar11,(size_t)pfVar9,(void *)0x0,0,ppfVar10,sVar5 + 1);
    pcStack_1d768 = (code *)0x119597;
    fVar3 = fdb_set(pfStack_1d740,(fdb_doc *)pfStack_1d750);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b0;
    pcStack_1d768 = (code *)0x1195ae;
    fVar3 = fdb_commit(pfStack_1d748,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196b5;
    pcStack_1d768 = (code *)0x1195cf;
    sprintf((char *)(pfStack_1d750->field_6).seqtree,"bOdy%d",0);
    pcStack_1d768 = (code *)0x1195de;
    fVar3 = fdb_set(pfStack_1d738,(fdb_doc *)pfStack_1d750);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196ba;
    pcStack_1d768 = (code *)0x1195f5;
    fVar3 = fdb_commit(pfStack_1d748,'\x01');
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196bf;
    pcStack_1d768 = (code *)0x11960c;
    fVar3 = fdb_get_metaonly(pfStack_1d740,(fdb_doc *)pfStack_1d750);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c4;
    pcStack_1d768 = (code *)0x119623;
    fVar3 = fdb_get_metaonly(pfStack_1d738,(fdb_doc *)pfStack_1d750);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_001196c9;
    pcStack_1d768 = (code *)0x11963a;
    fVar3 = fdb_get_byoffset(pfStack_1d740,(fdb_doc *)pfStack_1d750);
    if (fVar3 == FDB_RESULT_KEY_NOT_FOUND) {
      pcStack_1d768 = (code *)0x11964d;
      fdb_close(pfStack_1d748);
      pcStack_1d768 = (code *)0x119657;
      fdb_doc_free((fdb_doc *)pfStack_1d750);
      pcStack_1d768 = (code *)0x11965c;
      fdb_shutdown();
      pcStack_1d768 = (code *)0x119661;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (get_byoffset_diff_kvs_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pcStack_1d768 = (code *)0x119692;
      fprintf(_stderr,pcVar16,"get byoffset diff kvs");
      return;
    }
  }
  else {
    pcStack_1d768 = (code *)0x1196a6;
    get_byoffset_diff_kvs_test();
LAB_001196a6:
    pcStack_1d768 = (code *)0x1196ab;
    get_byoffset_diff_kvs_test();
LAB_001196ab:
    pcStack_1d768 = (code *)0x1196b0;
    get_byoffset_diff_kvs_test();
LAB_001196b0:
    pcStack_1d768 = (code *)0x1196b5;
    get_byoffset_diff_kvs_test();
LAB_001196b5:
    pcStack_1d768 = (code *)0x1196ba;
    get_byoffset_diff_kvs_test();
LAB_001196ba:
    pcStack_1d768 = (code *)0x1196bf;
    get_byoffset_diff_kvs_test();
LAB_001196bf:
    pcStack_1d768 = (code *)0x1196c4;
    get_byoffset_diff_kvs_test();
LAB_001196c4:
    pcStack_1d768 = (code *)0x1196c9;
    get_byoffset_diff_kvs_test();
LAB_001196c9:
    pcStack_1d768 = (code *)0x1196ce;
    get_byoffset_diff_kvs_test();
  }
  pcStack_1d768 = rekey_test;
  get_byoffset_diff_kvs_test();
  pfStack_1d790 = pfVar11;
  ppfStack_1d788 = ppfVar21;
  pfStack_1d780 = (fdb_kvs_handle *)pcVar16;
  ppfStack_1d778 = ppfVar10;
  pfStack_1d770 = pfVar9;
  pcStack_1d768 = (code *)uVar18;
  gettimeofday(&tStack_1dba0,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  dummy* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fStack_1db90.wal_threshold = 0x400;
  fStack_1db90.flags = 1;
  fStack_1db90.purging_interval = 0;
  fStack_1db90.compaction_threshold = '\0';
  fStack_1db90.encryption_key.algorithm = -1;
  builtin_memcpy(fStack_1db90.encryption_key.bytes,"BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB",0x20);
  fdb_open(&pfStack_1dbf8,"./dummy1",&fStack_1db90);
  fdb_kvs_open_default(pfStack_1dbf8,&pfStack_1dc00,&fStack_1dbb8);
  fVar3 = fdb_set_log_callback(pfStack_1dc00,logCallbackFunc,"api_wrapper_test");
  if (fVar3 == FDB_RESULT_SUCCESS) {
    fVar3 = fdb_set_kv(pfStack_1dc00,(void *)0x0,0,(void *)0x0,0);
    if (fVar3 != FDB_RESULT_INVALID_ARGS) goto LAB_00119a28;
    uVar18 = 0;
    do {
      sprintf(acStack_1d998,"key%d",uVar18);
      sprintf(acStack_1d898,"body%d",uVar18);
      pfVar9 = pfStack_1dc00;
      sVar5 = strlen(acStack_1d998);
      sVar6 = strlen(acStack_1d898);
      fVar3 = fdb_set_kv(pfVar9,acStack_1d998,sVar5,acStack_1d898,sVar6);
      if (fVar3 != FDB_RESULT_SUCCESS) {
        rekey_test();
        goto LAB_00119a0a;
      }
      uVar14 = (int)uVar18 + 1;
      uVar18 = (ulong)uVar14;
    } while (uVar14 != 10);
    asStack_1dbe8[1] = 0x726162ffffffff;
    asStack_1dbe8[2] = 0xbdbdbdbdbdbdbdbd;
    uStack_1dbd0 = 0xbdbdbdbd;
    uStack_1dbcc = 0xbdbdbdbd;
    uStack_1dbc8 = 0xbdbdbdbd;
    uStack_1dbc4 = 0xbdbdbdbd;
    uStack_1dbc0 = 0xbdbdbdbd;
    new_key.bytes[4] = 0xbd;
    new_key.bytes[5] = 0xbd;
    new_key.bytes[6] = 0xbd;
    new_key.bytes[7] = 0xbd;
    new_key.bytes[8] = 0xbd;
    new_key.bytes[9] = 0xbd;
    new_key.bytes[10] = 0xbd;
    new_key.bytes[0xb] = 0xbd;
    new_key.algorithm = -1;
    new_key.bytes[0] = 'b';
    new_key.bytes[1] = 'a';
    new_key.bytes[2] = 'r';
    new_key.bytes[3] = '\0';
    new_key.bytes[0xc] = 0xbd;
    new_key.bytes[0xd] = 0xbd;
    new_key.bytes[0xe] = 0xbd;
    new_key.bytes[0xf] = 0xbd;
    new_key.bytes[0x10] = 0xbd;
    new_key.bytes[0x11] = 0xbd;
    new_key.bytes[0x12] = 0xbd;
    new_key.bytes[0x13] = 0xbd;
    new_key.bytes[0x14] = 0xbd;
    new_key.bytes[0x15] = 0xbd;
    new_key.bytes[0x16] = 0xbd;
    new_key.bytes[0x17] = 0xbd;
    new_key.bytes[0x18] = 0xbd;
    new_key.bytes[0x19] = 0xbd;
    new_key.bytes[0x1a] = 0xbd;
    new_key.bytes[0x1b] = 0xbd;
    new_key.bytes[0x1c] = 0xbd;
    new_key.bytes[0x1d] = 0xbd;
    new_key.bytes[0x1e] = 0xbd;
    new_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_rekey(pfStack_1dbf8,new_key);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a2d;
    fdb_kvs_close(pfStack_1dc00);
    fdb_close(pfStack_1dbf8);
    fStack_1db90.encryption_key.algorithm = -1;
    builtin_memcpy(fStack_1db90.encryption_key.bytes,"bar",4);
    fStack_1db90.encryption_key.bytes[4] = 0xbd;
    fStack_1db90.encryption_key.bytes[5] = 0xbd;
    fStack_1db90.encryption_key.bytes[6] = 0xbd;
    fStack_1db90.encryption_key.bytes[7] = 0xbd;
    fStack_1db90.encryption_key.bytes[8] = 0xbd;
    fStack_1db90.encryption_key.bytes[9] = 0xbd;
    fStack_1db90.encryption_key.bytes[10] = 0xbd;
    fStack_1db90.encryption_key.bytes[0xb] = 0xbd;
    fStack_1db90.encryption_key.bytes[0xc] = 0xbd;
    fStack_1db90.encryption_key.bytes[0xd] = 0xbd;
    fStack_1db90.encryption_key.bytes[0xe] = 0xbd;
    fStack_1db90.encryption_key.bytes[0xf] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x10] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x11] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x12] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x13] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x14] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x15] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x16] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x17] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x18] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x19] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1a] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1b] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1c] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1d] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1e] = 0xbd;
    fStack_1db90.encryption_key.bytes[0x1f] = 0xbd;
    fVar3 = fdb_open(&pfStack_1dbf8,"./dummy1",&fStack_1db90);
    if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a34;
    fVar3 = fdb_kvs_open_default(pfStack_1dbf8,&pfStack_1dc00,&fStack_1dbb8);
    if (fVar3 == FDB_RESULT_SUCCESS) {
      fVar3 = fdb_set_log_callback(pfStack_1dc00,logCallbackFunc,"api_wrapper_test");
      if (fVar3 != FDB_RESULT_SUCCESS) goto LAB_00119a42;
      uVar18 = 0;
      while( true ) {
        sprintf(acStack_1d998,"key%d",uVar18);
        pfVar9 = pfStack_1dc00;
        sVar5 = strlen(acStack_1d998);
        fVar3 = fdb_get_kv(pfVar9,acStack_1d998,sVar5,&pvStack_1dbf0,asStack_1dbe8);
        if (fVar3 != FDB_RESULT_SUCCESS) break;
        sprintf(acStack_1da98,"body%d",uVar18);
        ptr = pvStack_1dbf0;
        iVar4 = bcmp(pvStack_1dbf0,acStack_1da98,asStack_1dbe8[0]);
        if (iVar4 != 0) goto LAB_00119a0a;
        fdb_free_block(ptr);
        uVar14 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar14;
        if (uVar14 == 10) {
          fdb_kvs_close(pfStack_1dc00);
          fdb_close(pfStack_1dbf8);
          fdb_shutdown();
          memleak_end();
          pcVar16 = "%s PASSED\n";
          if (rekey_test()::__test_pass != '\0') {
            pcVar16 = "%s FAILED\n";
          }
          fprintf(_stderr,pcVar16,"encryption rekey test");
          return;
        }
      }
LAB_00119a1a:
      rekey_test();
      goto LAB_00119a21;
    }
  }
  else {
LAB_00119a21:
    rekey_test();
LAB_00119a28:
    rekey_test();
LAB_00119a2d:
    rekey_test();
LAB_00119a34:
    rekey_test();
  }
  rekey_test();
LAB_00119a42:
  rekey_test();
  return;
}

Assistant:

void doc_compression_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    int dummy_len = 32;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256], temp[256];

    // remove previous dummy files
    r = system(SHELL_DEL" dummy* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compress_document_body = true;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1;

    // open db
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set dummy str
    memset(temp, 'a', dummy_len);
    temp[dummy_len]=0;

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d_%s", i, temp);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // remove document #5
    fdb_doc_create(&rdoc, doc[5]->key, doc[5]->keylen, doc[5]->meta, doc[5]->metalen, NULL, 0);
    status = fdb_del(db, rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // reopen
    fdb_open(&dbfile, "./dummy1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "doc_compression_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update dummy str
    dummy_len = 64;
    memset(temp, 'b', dummy_len);
    temp[dummy_len]=0;

    // update document #0 and #1
    for (i=0;i<2;++i){
        sprintf(metabuf, "newmeta%d", i);
        sprintf(bodybuf, "newbody%d_%s", i, temp);
        fdb_doc_update(&doc[i], (void *)metabuf, strlen(metabuf),
            (void *)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // do compaction
    fdb_compact(dbfile, (char *) "./dummy2");

    // retrieve documents after compaction
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        if (i != 5) {
            // updated documents
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
            TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        } else {
            // removed document
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        }

        // free result document
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("document compression test");
}